

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined6 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined5 uVar40;
  unkbyte9 Var41;
  int iVar42;
  int iVar43;
  int iVar44;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  char cVar45;
  char cVar50;
  short sVar46;
  short sVar47;
  short sVar48;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar60;
  short sVar58;
  short sVar59;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  undefined1 auVar49 [16];
  char cVar67;
  char cVar68;
  char cVar69;
  __m128i _sh00_2;
  __m128i _sl00_2;
  __m128i _extw0123_1;
  __m128i _w0123_1;
  __m128i _val_1;
  int j_2;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00_1;
  __m128i _sl00_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw01_1;
  __m128i _w01_1;
  __m128i _val0_1;
  __m128i _extval01_1;
  __m128i _val01_1;
  int j_3;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn1_1;
  int nn4_1;
  char *kptr0_1;
  char *tmpptr_3;
  __m128i _sh00;
  __m128i _sl00;
  __m128i _extw0123;
  __m128i _w0123;
  __m128i _val;
  int j;
  __m128i _sum11_sh;
  __m128i _sum10_sh;
  __m128i _sum01_sh;
  __m128i _sum00_sh;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw01;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j_1;
  __m128i _sum11;
  __m128i _sum01;
  __m128i _sum10;
  __m128i _sum00;
  int nn1;
  int nn4;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr0;
  int p;
  int k_3;
  char *img0_3;
  int k_2;
  char *img3_1;
  char *img2_1;
  char *img1_1;
  char *img0_2;
  int q_1;
  char *tmpptr_1;
  int i_1;
  int k_1;
  char *img0_1;
  int k;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int q;
  char *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_15;
  Mat *m_13;
  Mat *m_12;
  Mat *m_6;
  Mat *m;
  Mat *m_16;
  Mat *m_14;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Option *in_stack_ffffffffffffde98;
  Mat *in_stack_ffffffffffffdea0;
  Mat *in_stack_ffffffffffffdea8;
  void **ppvVar70;
  undefined4 in_stack_ffffffffffffdeb0;
  undefined2 in_stack_ffffffffffffdeb4;
  undefined2 in_stack_ffffffffffffdeb6;
  size_t in_stack_ffffffffffffdeb8;
  undefined8 in_stack_ffffffffffffdec0;
  int iVar71;
  int in_stack_ffffffffffffdec8;
  int in_stack_ffffffffffffdecc;
  Mat *in_stack_ffffffffffffded0;
  Allocator *in_stack_ffffffffffffdf30;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e30;
  int local_1e0c;
  undefined1 local_1dc8 [16];
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  int local_1d0c;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cb8;
  undefined8 local_1cb0;
  undefined8 local_1ca8;
  undefined4 local_1ca0;
  long local_1c98;
  undefined4 local_1c90;
  undefined4 local_1c8c;
  undefined4 local_1c88;
  undefined4 local_1c84;
  undefined4 local_1c80;
  undefined8 local_1c78;
  long *local_1c70;
  undefined8 local_1c68;
  undefined8 local_1c60;
  undefined8 local_1c58;
  undefined4 local_1c50;
  long *local_1c48;
  undefined4 local_1c40;
  undefined4 local_1c3c;
  undefined4 local_1c38;
  undefined4 local_1c34;
  undefined4 local_1c30;
  undefined8 local_1c28;
  long *local_1c20;
  undefined1 local_1c18 [16];
  short local_1c08;
  short sStack_1c06;
  short sStack_1c04;
  short sStack_1c02;
  short sStack_1c00;
  short sStack_1bfe;
  short sStack_1bfc;
  short sStack_1bfa;
  char local_1bf8;
  char cStack_1bf7;
  char cStack_1bf6;
  char cStack_1bf5;
  char cStack_1bf4;
  char cStack_1bf3;
  char cStack_1bf2;
  char cStack_1bf1;
  undefined1 uStack_1bf0;
  undefined1 uStack_1bef;
  undefined1 uStack_1bee;
  undefined1 uStack_1bed;
  undefined1 uStack_1bec;
  undefined1 uStack_1beb;
  undefined1 uStack_1bea;
  undefined1 uStack_1be9;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  int local_1bbc;
  int local_1bb8;
  int iStack_1bb4;
  int iStack_1bb0;
  int iStack_1bac;
  int local_1ba8;
  int iStack_1ba4;
  int iStack_1ba0;
  int iStack_1b9c;
  int local_1b98;
  int iStack_1b94;
  int iStack_1b90;
  int iStack_1b8c;
  int local_1b88;
  int iStack_1b84;
  int iStack_1b80;
  int iStack_1b7c;
  char local_1b78;
  char cStack_1b77;
  char cStack_1b76;
  char cStack_1b75;
  char cStack_1b74;
  char cStack_1b73;
  char cStack_1b72;
  char cStack_1b71;
  char cStack_1b70;
  char cStack_1b6f;
  char cStack_1b6e;
  char cStack_1b6d;
  char cStack_1b6c;
  char cStack_1b6b;
  undefined1 uStack_1b6a;
  char cStack_1b69;
  char local_1b68;
  char cStack_1b67;
  char cStack_1b66;
  char cStack_1b65;
  char cStack_1b64;
  char cStack_1b63;
  char cStack_1b62;
  char cStack_1b61;
  char cStack_1b60;
  char cStack_1b5f;
  char cStack_1b5e;
  char cStack_1b5d;
  char cStack_1b5c;
  char cStack_1b5b;
  undefined1 uStack_1b5a;
  char cStack_1b59;
  char local_1b58;
  char cStack_1b57;
  char cStack_1b56;
  char cStack_1b55;
  char cStack_1b54;
  char cStack_1b53;
  char cStack_1b52;
  char cStack_1b51;
  char cStack_1b50;
  char cStack_1b4f;
  char cStack_1b4e;
  char cStack_1b4d;
  char cStack_1b4c;
  char cStack_1b4b;
  char cStack_1b4a;
  char cStack_1b49;
  long local_1b48;
  long lStack_1b40;
  undefined1 local_1b38 [16];
  undefined4 local_1b28;
  undefined4 uStack_1b24;
  undefined4 uStack_1b20;
  undefined4 uStack_1b1c;
  char local_1b18;
  char cStack_1b17;
  char cStack_1b16;
  char cStack_1b15;
  char cStack_1b14;
  char cStack_1b13;
  char cStack_1b12;
  char cStack_1b11;
  undefined1 uStack_1b10;
  undefined1 uStack_1b0f;
  undefined1 uStack_1b0e;
  undefined1 uStack_1b0d;
  undefined1 uStack_1b0c;
  undefined1 uStack_1b0b;
  undefined1 uStack_1b0a;
  undefined1 uStack_1b09;
  char local_1b08;
  char cStack_1b07;
  char cStack_1b06;
  char cStack_1b05;
  char cStack_1b04;
  char cStack_1b03;
  char cStack_1b02;
  char cStack_1b01;
  char cStack_1b00;
  char cStack_1aff;
  char cStack_1afe;
  char cStack_1afd;
  char cStack_1afc;
  char cStack_1afb;
  undefined1 uStack_1afa;
  char cStack_1af9;
  int local_1aec;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  int local_1aa8;
  int local_1aa4;
  undefined8 local_1aa0;
  undefined8 local_1a98;
  undefined8 local_1a90;
  undefined4 local_1a88;
  long local_1a80;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined4 local_1a70;
  undefined4 local_1a6c;
  undefined4 local_1a68;
  undefined8 local_1a60;
  long *local_1a58;
  undefined8 local_1a50;
  undefined8 local_1a48;
  undefined8 local_1a40;
  undefined4 local_1a38;
  long *local_1a30;
  undefined4 local_1a28;
  undefined4 local_1a24;
  undefined4 local_1a20;
  undefined4 local_1a1c;
  undefined4 local_1a18;
  undefined8 local_1a10;
  long *local_1a08;
  int local_19fc;
  undefined8 local_19f8;
  undefined8 local_19f0;
  undefined8 local_19e8;
  undefined4 local_19e0;
  long local_19d8;
  undefined4 local_19d0;
  undefined4 local_19cc;
  undefined4 local_19c8;
  undefined4 local_19c4;
  undefined4 local_19c0;
  undefined8 local_19b8;
  undefined8 *local_19b0;
  int local_19a8;
  int local_19a4;
  undefined8 local_19a0;
  undefined8 local_1998;
  undefined8 local_1990;
  undefined4 local_1988;
  long local_1980;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined8 local_1960;
  undefined1 *local_1958;
  int local_194c;
  undefined8 local_1948;
  undefined8 local_1940;
  undefined8 local_1938;
  undefined4 local_1930;
  long local_1928;
  undefined4 local_1920;
  undefined4 local_191c;
  undefined4 local_1918;
  undefined4 local_1914;
  undefined4 local_1910;
  undefined8 local_1908;
  undefined1 *local_1900;
  undefined8 local_18f8;
  undefined8 local_18f0;
  undefined8 local_18e8;
  undefined4 local_18e0;
  long local_18d8;
  undefined4 local_18d0;
  undefined4 local_18cc;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined4 local_18c0;
  undefined8 local_18b8;
  undefined1 *local_18b0;
  undefined8 local_18a8;
  undefined8 local_18a0;
  undefined8 local_1898;
  undefined4 local_1890;
  long local_1888;
  undefined4 local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  undefined4 local_1874;
  undefined4 local_1870;
  undefined8 local_1868;
  undefined1 *local_1860;
  undefined8 local_1858;
  undefined8 local_1850;
  undefined8 local_1848;
  undefined4 local_1840;
  long local_1838;
  undefined4 local_1830;
  undefined4 local_182c;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined4 local_1820;
  undefined8 local_1818;
  undefined1 *local_1810;
  int local_1804;
  undefined8 local_1800;
  undefined8 local_17f8;
  undefined8 local_17f0;
  undefined4 local_17e8;
  long *local_17e0;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined8 local_17c0;
  undefined1 *local_17b8;
  int local_17b0;
  int local_17ac;
  undefined8 local_17a8;
  undefined8 local_17a0;
  undefined8 local_1798;
  undefined4 local_1790;
  long local_1788;
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined8 local_1768;
  undefined1 *local_1760;
  int local_1754;
  undefined8 local_1750;
  undefined8 local_1748;
  undefined8 local_1740;
  undefined4 local_1738;
  long local_1730;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined8 local_1710;
  undefined1 *local_1708;
  undefined8 local_1700;
  undefined8 local_16f8;
  undefined8 local_16f0;
  undefined4 local_16e8;
  long local_16e0;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined8 local_16c0;
  undefined1 *local_16b8;
  undefined8 local_16b0;
  undefined8 local_16a8;
  undefined8 local_16a0;
  undefined4 local_1698;
  long local_1690;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined8 local_1670;
  undefined1 *local_1668;
  undefined8 local_1660;
  undefined8 local_1658;
  undefined8 local_1650;
  undefined4 local_1648;
  long local_1640;
  undefined4 local_1638;
  undefined4 local_1634;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined8 local_1620;
  undefined1 *local_1618;
  int local_160c;
  undefined8 local_1608;
  undefined8 local_1600;
  undefined8 local_15f8;
  undefined4 local_15f0;
  long *local_15e8;
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined8 local_15c8;
  undefined1 *local_15c0;
  int local_15b4;
  int local_15b0;
  int local_15ac;
  int local_15a8;
  void *local_1598;
  int *local_1590;
  long local_1588;
  undefined4 local_1580;
  long *local_1578;
  undefined4 local_1570;
  int local_156c;
  int local_1568;
  undefined4 local_1564;
  undefined4 local_1560;
  long local_1558;
  int local_1550;
  int local_154c;
  int local_1548;
  int local_1544;
  long *local_1538;
  long *local_1530;
  long *local_1528;
  void **local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 *local_1508;
  undefined8 *local_1500;
  undefined8 *local_14f8;
  undefined8 *local_14f0;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 *local_14d8;
  undefined8 *local_14d0;
  undefined8 *local_14c8;
  undefined8 *local_14c0;
  undefined8 *local_14b8;
  undefined8 *local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1498;
  void **local_1490;
  int local_1470;
  undefined4 local_146c;
  void **local_1468;
  undefined8 *local_1458;
  undefined8 *local_1448;
  undefined8 *local_1438;
  undefined8 *local_1428;
  undefined8 *local_1418;
  undefined8 *local_1408;
  undefined8 *local_13f8;
  undefined8 *local_13e8;
  undefined8 *local_13d8;
  undefined8 *local_13c8;
  undefined8 *local_13b8;
  undefined8 *local_13a8;
  undefined8 *local_1398;
  undefined8 *local_1388;
  undefined8 *local_1378;
  undefined8 *local_1368;
  undefined8 *local_1358;
  undefined1 local_134d;
  int local_134c;
  void **local_1348;
  undefined8 *local_1340;
  undefined1 local_131d;
  int local_131c;
  void **local_1318;
  undefined8 *local_1310;
  undefined1 local_12ed;
  int local_12ec;
  undefined8 *local_12e0;
  undefined1 local_12bd;
  int local_12bc;
  void **local_12b8;
  undefined8 *local_12b0;
  undefined1 local_128d;
  int local_128c;
  void **local_1288;
  undefined8 *local_1280;
  undefined1 local_125d;
  int local_125c;
  undefined8 *local_1250;
  undefined1 local_122d;
  int local_122c;
  undefined8 *local_1220;
  undefined1 local_11fd;
  int local_11fc;
  undefined8 *local_11f0;
  undefined1 local_11cd;
  int local_11cc;
  undefined8 *local_11c0;
  undefined1 local_119d;
  int local_119c;
  undefined8 *local_1190;
  undefined1 local_116d;
  int local_116c;
  undefined8 *local_1160;
  undefined1 local_113d;
  int local_113c;
  undefined8 *local_1130;
  undefined1 local_110d;
  int local_110c;
  undefined8 *local_1100;
  undefined1 local_10dd;
  int local_10dc;
  undefined8 *local_10d0;
  undefined1 local_10ad;
  int local_10ac;
  undefined8 *local_10a0;
  undefined1 local_107d;
  int local_107c;
  undefined8 *local_1070;
  undefined1 local_104d;
  int local_104c;
  undefined8 *local_1040;
  void *local_f10;
  long local_f00;
  undefined4 local_ef4;
  long local_ef0;
  long local_ee8;
  undefined4 local_edc;
  int local_ed8;
  int local_ed4;
  undefined8 *local_ed0;
  long local_ec8;
  undefined4 local_ebc;
  long local_eb8;
  long local_eb0;
  undefined4 local_ea4;
  int local_ea0;
  int local_e9c;
  undefined8 *local_e98;
  long local_e90;
  undefined4 local_e84;
  long local_e80;
  long local_e78;
  undefined4 local_e6c;
  int local_e68;
  int local_e64;
  undefined8 *local_e60;
  long local_e58;
  undefined4 local_e4c;
  long local_e48;
  long local_e40;
  undefined4 local_e34;
  int local_e30;
  int local_e2c;
  undefined8 *local_e28;
  long local_e20;
  undefined4 local_e14;
  long local_e10;
  long local_e08;
  undefined4 local_dfc;
  int local_df8;
  int local_df4;
  undefined8 *local_df0;
  long local_de8;
  undefined4 local_ddc;
  long local_dd8;
  long local_dd0;
  undefined4 local_dc4;
  int local_dc0;
  int local_dbc;
  undefined8 *local_db8;
  long local_db0;
  undefined4 local_da4;
  long local_da0;
  long local_d98;
  undefined4 local_d8c;
  int local_d88;
  int local_d84;
  undefined8 *local_d80;
  long local_d78;
  undefined4 local_d6c;
  long local_d68;
  long local_d60;
  undefined4 local_d54;
  int local_d50;
  int local_d4c;
  undefined8 *local_d48;
  long local_d40;
  undefined4 local_d34;
  long local_d30;
  long local_d28;
  undefined4 local_d1c;
  int local_d18;
  int local_d14;
  undefined8 *local_d10;
  long local_d08;
  undefined4 local_cfc;
  long local_cf8;
  long local_cf0;
  undefined4 local_ce4;
  int local_ce0;
  int local_cdc;
  undefined8 *local_cd8;
  long local_cd0;
  undefined4 local_cc4;
  long local_cc0;
  long *local_cb8;
  undefined4 local_cac;
  int local_ca8;
  int local_ca4;
  undefined8 *local_ca0;
  long local_c98;
  undefined4 local_c8c;
  long local_c88;
  long *local_c80;
  undefined4 local_c74;
  int local_c70;
  int local_c6c;
  undefined8 *local_c68;
  long *local_c60;
  undefined4 local_c54;
  long local_c50;
  undefined1 *local_c48;
  undefined4 local_c3c;
  int local_c38;
  int local_c34;
  undefined8 *local_c30;
  long *local_c28;
  undefined4 local_c1c;
  long local_c18;
  undefined1 *local_c10;
  undefined4 local_c04;
  int local_c00;
  int local_bfc;
  undefined8 *local_bf8;
  long local_bf0;
  undefined4 local_be4;
  long local_be0;
  undefined8 *local_bd8;
  undefined4 local_bcc;
  int local_bc8;
  int local_bc4;
  undefined8 *local_bc0;
  long *local_bb8;
  undefined4 local_bac;
  long local_ba8;
  long *local_ba0;
  undefined4 local_b94;
  int local_b90;
  int local_b8c;
  undefined8 *local_b88;
  long *local_b80;
  undefined4 local_b74;
  long local_b70;
  long *local_b68;
  undefined4 local_b5c;
  int local_b58;
  int local_b54;
  undefined8 *local_b50;
  undefined4 local_b44;
  long local_b40;
  undefined4 local_b34;
  long local_b30;
  undefined4 local_b24;
  long local_b20;
  undefined4 local_b14;
  long local_b10;
  undefined4 local_b04;
  long local_b00;
  undefined4 local_af4;
  long local_af0;
  undefined4 local_ae4;
  long local_ae0;
  undefined4 local_ad4;
  long local_ad0;
  undefined4 local_ac4;
  long local_ac0;
  undefined4 local_ab4;
  long local_ab0;
  undefined4 local_aa4;
  long local_aa0;
  undefined4 local_a94;
  long local_a90;
  undefined4 local_a84;
  long local_a80;
  undefined4 local_a74;
  long local_a70;
  undefined4 local_a64;
  long local_a60;
  undefined4 local_a54;
  long local_a50;
  undefined4 local_a44;
  long local_a40;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined1 local_8a8 [16];
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  long *local_7c8;
  long *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  long local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  long local_578;
  long lStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  long local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  long local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  long local_518;
  long lStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  long local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  long local_4d8;
  long lStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  long local_4b8;
  long lStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  undefined8 local_2e8;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  long local_2a8;
  undefined8 uStack_2a0;
  long *local_290;
  long local_288;
  undefined8 uStack_280;
  long *local_270;
  long local_268;
  undefined8 uStack_260;
  long *local_250;
  long local_248;
  undefined8 uStack_240;
  long *local_238;
  short local_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  short local_198;
  short local_196;
  short local_194;
  short local_192;
  short local_190;
  short local_18e;
  short local_18c;
  short local_18a;
  undefined8 local_188;
  undefined8 uStack_180;
  short local_178;
  short local_176;
  short local_174;
  short local_172;
  short local_170;
  short local_16e;
  short local_16c;
  short local_16a;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  iVar71 = (int)((ulong)in_stack_ffffffffffffdec0 >> 0x20);
  local_1538 = in_RDX;
  local_1530 = in_RSI;
  local_1528 = in_RDI;
  iVar44 = cpu_support_x86_xop();
  if (iVar44 == 0) {
    local_1544 = *(int *)((long)local_1528 + 0x2c);
    local_1548 = (int)local_1528[6];
    local_154c = (int)local_1528[7];
    local_1550 = (int)local_1530[7];
    local_1520 = &local_1598;
    local_1598 = (void *)0x0;
    local_1590 = (int *)0x0;
    local_1588 = 0;
    local_1580 = 0;
    local_1578 = (long *)0x0;
    local_1570 = 0;
    local_156c = 0;
    local_1568 = 0;
    local_1564 = 0;
    local_1560 = 0;
    local_1558 = 0;
    if (local_154c < 4) {
      if (local_1544 < 2) {
        Mat::create(in_stack_ffffffffffffded0,in_stack_ffffffffffffdecc,in_stack_ffffffffffffdec8,
                    iVar71,in_stack_ffffffffffffdeb8,
                    CONCAT22(in_stack_ffffffffffffdeb6,in_stack_ffffffffffffdeb4),
                    in_stack_ffffffffffffdf30);
      }
      else {
        Mat::create(in_stack_ffffffffffffded0,in_stack_ffffffffffffdecc,in_stack_ffffffffffffdec8,
                    iVar71,in_stack_ffffffffffffdeb8,
                    CONCAT22(in_stack_ffffffffffffdeb6,in_stack_ffffffffffffdeb4),
                    in_stack_ffffffffffffdf30);
      }
    }
    else if (local_1544 < 2) {
      Mat::create(in_stack_ffffffffffffded0,in_stack_ffffffffffffdecc,in_stack_ffffffffffffdec8,
                  iVar71,in_stack_ffffffffffffdeb8,
                  CONCAT22(in_stack_ffffffffffffdeb6,in_stack_ffffffffffffdeb4),
                  in_stack_ffffffffffffdf30);
    }
    else {
      Mat::create(in_stack_ffffffffffffded0,in_stack_ffffffffffffdecc,in_stack_ffffffffffffdec8,
                  iVar71,in_stack_ffffffffffffdeb8,
                  CONCAT22(in_stack_ffffffffffffdeb6,in_stack_ffffffffffffdeb4),
                  in_stack_ffffffffffffdf30);
    }
    local_15ac = local_1544 >> 1;
    for (local_15b0 = 0; local_15b0 < local_15ac; local_15b0 = local_15b0 + 1) {
      local_15b4 = local_15b0 * 2;
      local_128c = local_15b4 / 2;
      local_1280 = &local_1608;
      local_1288 = &local_1598;
      local_c48 = (undefined1 *)((long)local_1598 + local_1558 * local_128c * local_1588);
      local_c30 = &local_1608;
      local_b00 = (long)local_156c * (long)local_1568 * local_1588;
      local_830 = &local_1608;
      local_1518 = &local_1608;
      local_15e8 = local_1578;
      local_b04 = 0x10;
      local_c34 = local_156c;
      local_c38 = local_1568;
      local_c3c = local_1564;
      local_c50 = local_1588;
      local_c54 = local_1580;
      local_c60 = local_1578;
      local_128d = 1;
      local_1608 = 0;
      local_15f8 = 0;
      local_15f0 = 0;
      local_15e0 = 0;
      local_15dc = 0;
      local_15d8 = 0;
      local_15d4 = 0;
      local_15d0 = 0;
      local_15c8 = 0;
      local_1600 = 0;
      local_15c0 = local_c48;
      for (local_160c = 0; local_160c + 3 < local_154c; local_160c = local_160c + 4) {
        local_1040 = &local_1660;
        local_ed4 = *(int *)((long)local_1528 + 0x2c);
        local_ed8 = (int)local_1528[6];
        local_edc = *(undefined4 *)((long)local_1528 + 0x34);
        local_ee8 = *local_1528 + local_1528[8] * (long)local_160c * local_1528[2];
        local_ef0 = local_1528[2];
        local_ef4 = (undefined4)local_1528[3];
        local_f00 = local_1528[4];
        local_ed0 = &local_1660;
        local_a40 = (long)local_ed4 * (long)local_ed8 * local_ef0;
        local_7d0 = &local_1660;
        local_1618 = (undefined1 *)(local_ee8 + local_15b4);
        local_1510 = &local_1660;
        local_107c = local_160c + 1;
        local_1070 = &local_16b0;
        local_e9c = *(int *)((long)local_1528 + 0x2c);
        local_ea0 = (int)local_1528[6];
        local_ea4 = *(undefined4 *)((long)local_1528 + 0x34);
        local_eb0 = *local_1528 + local_1528[8] * (long)local_107c * local_1528[2];
        local_eb8 = local_1528[2];
        local_ebc = (undefined4)local_1528[3];
        local_ec8 = local_1528[4];
        local_e98 = &local_16b0;
        local_a50 = (long)local_e9c * (long)local_ea0 * local_eb8;
        local_7d8 = &local_16b0;
        local_1668 = (undefined1 *)(local_eb0 + local_15b4);
        local_1508 = &local_16b0;
        local_10ac = local_160c + 2;
        local_10a0 = &local_1700;
        local_e64 = *(int *)((long)local_1528 + 0x2c);
        local_e68 = (int)local_1528[6];
        local_e6c = *(undefined4 *)((long)local_1528 + 0x34);
        local_e78 = *local_1528 + local_1528[8] * (long)local_10ac * local_1528[2];
        local_e80 = local_1528[2];
        local_e84 = (undefined4)local_1528[3];
        local_e90 = local_1528[4];
        local_e60 = &local_1700;
        local_a60 = (long)local_e64 * (long)local_e68 * local_e80;
        local_7e0 = &local_1700;
        local_16b8 = (undefined1 *)(local_e78 + local_15b4);
        local_1500 = &local_1700;
        local_10dc = local_160c + 3;
        local_10d0 = &local_1750;
        local_e2c = *(int *)((long)local_1528 + 0x2c);
        local_e30 = (int)local_1528[6];
        local_e34 = *(undefined4 *)((long)local_1528 + 0x34);
        local_e40 = *local_1528 + local_1528[8] * (long)local_10dc * local_1528[2];
        local_e48 = local_1528[2];
        local_e4c = (undefined4)local_1528[3];
        local_e58 = local_1528[4];
        local_e28 = &local_1750;
        local_a70 = (long)local_e2c * (long)local_e30 * local_e48;
        local_7e8 = &local_1750;
        local_1708 = (undefined1 *)(local_e40 + local_15b4);
        local_14f8 = &local_1750;
        local_1628 = 0;
        local_162c = 0;
        local_1630 = 0;
        local_1634 = 0;
        local_1648 = 0;
        local_1650 = 0;
        local_1658 = 0;
        local_1660 = 0;
        local_1678 = 0;
        local_167c = 0;
        local_1680 = 0;
        local_1684 = 0;
        local_1698 = 0;
        local_16a0 = 0;
        local_16a8 = 0;
        local_16b0 = 0;
        local_16c8 = 0;
        local_16cc = 0;
        local_16d0 = 0;
        local_16d4 = 0;
        local_16e8 = 0;
        local_16f0 = 0;
        local_16f8 = 0;
        local_1700 = 0;
        local_a44 = 0x10;
        local_a54 = 0x10;
        local_a64 = 0x10;
        local_a74 = 0x10;
        local_104c = local_160c;
        local_104d = 1;
        local_107d = 1;
        local_10ad = 1;
        local_10dd = 1;
        local_1620 = 0;
        local_1638 = 0;
        local_1670 = 0;
        local_1688 = 0;
        local_16c0 = 0;
        local_16d8 = 0;
        local_1750 = 0;
        local_1740 = 0;
        local_1738 = 0;
        local_1728 = 0;
        local_1724 = 0;
        local_1720 = 0;
        local_171c = 0;
        local_1718 = 0;
        local_1710 = 0;
        local_1748 = 0;
        for (local_1754 = 0; local_1754 < local_1548; local_1754 = local_1754 + 1) {
          *local_15c0 = *local_1618;
          local_15c0[1] = *local_1668;
          local_15c0[2] = *local_16b8;
          local_15c0[3] = *local_1708;
          local_15c0[4] = local_1618[1];
          local_15c0[5] = local_1668[1];
          local_15c0[6] = local_16b8[1];
          local_15c0[7] = local_1708[1];
          local_15c0 = local_15c0 + 8;
          local_1618 = local_1618 + local_1544;
          local_1668 = local_1668 + local_1544;
          local_16b8 = local_16b8 + local_1544;
          local_1708 = local_1708 + local_1544;
        }
        local_1398 = local_14f8;
        local_1388 = local_1500;
        local_1378 = local_1508;
        local_1368 = local_1510;
        local_1730 = local_e58;
        local_16e0 = local_e90;
        local_1690 = local_ec8;
        local_1640 = local_f00;
      }
      for (; local_160c < local_154c; local_160c = local_160c + 1) {
        local_1100 = &local_17a8;
        local_df4 = *(int *)((long)local_1528 + 0x2c);
        local_df8 = (int)local_1528[6];
        local_dfc = *(undefined4 *)((long)local_1528 + 0x34);
        local_e08 = *local_1528 + local_1528[8] * (long)local_160c * local_1528[2];
        local_e10 = local_1528[2];
        local_e14 = (undefined4)local_1528[3];
        local_e20 = local_1528[4];
        local_df0 = &local_17a8;
        local_a80 = (long)local_df4 * (long)local_df8 * local_e10;
        local_a84 = 0x10;
        local_110c = local_160c;
        local_110d = 1;
        local_7f0 = &local_17a8;
        local_1760 = (undefined1 *)(local_e08 + local_15b4);
        local_14f0 = &local_17a8;
        local_17a8 = 0;
        local_1798 = 0;
        local_1790 = 0;
        local_1780 = 0;
        local_177c = 0;
        local_1778 = 0;
        local_1774 = 0;
        local_1770 = 0;
        local_1768 = 0;
        local_17a0 = 0;
        for (local_17ac = 0; local_17ac < local_1548; local_17ac = local_17ac + 1) {
          *local_15c0 = *local_1760;
          local_15c0[1] = local_1760[1];
          local_15c0 = local_15c0 + 2;
          local_1760 = local_1760 + local_1544;
        }
        local_13a8 = local_14f0;
        local_1788 = local_e20;
      }
      local_1358 = local_1518;
    }
    local_15a8 = local_15ac * 2;
    for (local_17b0 = local_15a8; local_17b0 < local_1544; local_17b0 = local_17b0 + 1) {
      local_12bc = local_17b0 / 2 + local_17b0 % 2;
      local_12b0 = &local_1800;
      local_12b8 = &local_1598;
      local_c10 = (undefined1 *)((long)local_1598 + local_1558 * local_12bc * local_1588);
      local_bf8 = &local_1800;
      local_b10 = (long)local_156c * (long)local_1568 * local_1588;
      local_838 = &local_1800;
      local_14e8 = &local_1800;
      local_17e0 = local_1578;
      local_b14 = 0x10;
      local_bfc = local_156c;
      local_c00 = local_1568;
      local_c04 = local_1564;
      local_c18 = local_1588;
      local_c1c = local_1580;
      local_c28 = local_1578;
      local_12bd = 1;
      local_1800 = 0;
      local_17f0 = 0;
      local_17e8 = 0;
      local_17d8 = 0;
      local_17d4 = 0;
      local_17d0 = 0;
      local_17cc = 0;
      local_17c8 = 0;
      local_17c0 = 0;
      local_17f8 = 0;
      local_17b8 = local_c10;
      for (local_1804 = 0; local_1804 + 3 < local_154c; local_1804 = local_1804 + 4) {
        local_1130 = &local_1858;
        local_dbc = *(int *)((long)local_1528 + 0x2c);
        local_dc0 = (int)local_1528[6];
        local_dc4 = *(undefined4 *)((long)local_1528 + 0x34);
        local_dd0 = *local_1528 + local_1528[8] * (long)local_1804 * local_1528[2];
        local_dd8 = local_1528[2];
        local_ddc = (undefined4)local_1528[3];
        local_de8 = local_1528[4];
        local_db8 = &local_1858;
        local_a90 = (long)local_dbc * (long)local_dc0 * local_dd8;
        local_7f8 = &local_1858;
        local_1810 = (undefined1 *)(local_dd0 + local_17b0);
        local_14e0 = &local_1858;
        local_116c = local_1804 + 1;
        local_1160 = &local_18a8;
        local_d84 = *(int *)((long)local_1528 + 0x2c);
        local_d88 = (int)local_1528[6];
        local_d8c = *(undefined4 *)((long)local_1528 + 0x34);
        local_d98 = *local_1528 + local_1528[8] * (long)local_116c * local_1528[2];
        local_da0 = local_1528[2];
        local_da4 = (undefined4)local_1528[3];
        local_db0 = local_1528[4];
        local_d80 = &local_18a8;
        local_aa0 = (long)local_d84 * (long)local_d88 * local_da0;
        local_800 = &local_18a8;
        local_1860 = (undefined1 *)(local_d98 + local_17b0);
        local_14d8 = &local_18a8;
        local_119c = local_1804 + 2;
        local_1190 = &local_18f8;
        local_d4c = *(int *)((long)local_1528 + 0x2c);
        local_d50 = (int)local_1528[6];
        local_d54 = *(undefined4 *)((long)local_1528 + 0x34);
        local_d60 = *local_1528 + local_1528[8] * (long)local_119c * local_1528[2];
        local_d68 = local_1528[2];
        local_d6c = (undefined4)local_1528[3];
        local_d78 = local_1528[4];
        local_d48 = &local_18f8;
        local_ab0 = (long)local_d4c * (long)local_d50 * local_d68;
        local_808 = &local_18f8;
        local_18b0 = (undefined1 *)(local_d60 + local_17b0);
        local_14d0 = &local_18f8;
        local_11cc = local_1804 + 3;
        local_11c0 = &local_1948;
        local_d14 = *(int *)((long)local_1528 + 0x2c);
        local_d18 = (int)local_1528[6];
        local_d1c = *(undefined4 *)((long)local_1528 + 0x34);
        local_d28 = *local_1528 + local_1528[8] * (long)local_11cc * local_1528[2];
        local_d30 = local_1528[2];
        local_d34 = (undefined4)local_1528[3];
        local_d40 = local_1528[4];
        local_d10 = &local_1948;
        local_ac0 = (long)local_d14 * (long)local_d18 * local_d30;
        local_810 = &local_1948;
        local_1900 = (undefined1 *)(local_d28 + local_17b0);
        local_14c8 = &local_1948;
        local_1820 = 0;
        local_1824 = 0;
        local_1828 = 0;
        local_182c = 0;
        local_1840 = 0;
        local_1848 = 0;
        local_1850 = 0;
        local_1858 = 0;
        local_1870 = 0;
        local_1874 = 0;
        local_1878 = 0;
        local_187c = 0;
        local_1890 = 0;
        local_1898 = 0;
        local_18a0 = 0;
        local_18a8 = 0;
        local_18c0 = 0;
        local_18c4 = 0;
        local_18c8 = 0;
        local_18cc = 0;
        local_18e0 = 0;
        local_18e8 = 0;
        local_18f0 = 0;
        local_18f8 = 0;
        local_a94 = 0x10;
        local_aa4 = 0x10;
        local_ab4 = 0x10;
        local_ac4 = 0x10;
        local_113c = local_1804;
        local_113d = 1;
        local_116d = 1;
        local_119d = 1;
        local_11cd = 1;
        local_1818 = 0;
        local_1830 = 0;
        local_1868 = 0;
        local_1880 = 0;
        local_18b8 = 0;
        local_18d0 = 0;
        local_1948 = 0;
        local_1938 = 0;
        local_1930 = 0;
        local_1920 = 0;
        local_191c = 0;
        local_1918 = 0;
        local_1914 = 0;
        local_1910 = 0;
        local_1908 = 0;
        local_1940 = 0;
        for (local_194c = 0; local_194c < local_1548; local_194c = local_194c + 1) {
          *local_17b8 = *local_1810;
          local_17b8[1] = *local_1860;
          local_17b8[2] = *local_18b0;
          local_17b8[3] = *local_1900;
          local_17b8 = local_17b8 + 4;
          local_1810 = local_1810 + local_1544;
          local_1860 = local_1860 + local_1544;
          local_18b0 = local_18b0 + local_1544;
          local_1900 = local_1900 + local_1544;
        }
        local_13f8 = local_14c8;
        local_13e8 = local_14d0;
        local_13d8 = local_14d8;
        local_13c8 = local_14e0;
        local_1928 = local_d40;
        local_18d8 = local_d78;
        local_1888 = local_db0;
        local_1838 = local_de8;
      }
      for (; local_1804 < local_154c; local_1804 = local_1804 + 1) {
        local_11f0 = &local_19a0;
        local_cdc = *(int *)((long)local_1528 + 0x2c);
        local_ce0 = (int)local_1528[6];
        local_ce4 = *(undefined4 *)((long)local_1528 + 0x34);
        local_cf0 = *local_1528 + local_1528[8] * (long)local_1804 * local_1528[2];
        local_cf8 = local_1528[2];
        local_cfc = (undefined4)local_1528[3];
        local_d08 = local_1528[4];
        local_cd8 = &local_19a0;
        local_ad0 = (long)local_cdc * (long)local_ce0 * local_cf8;
        local_ad4 = 0x10;
        local_11fc = local_1804;
        local_11fd = 1;
        local_818 = &local_19a0;
        local_1958 = (undefined1 *)(local_cf0 + local_17b0);
        local_14c0 = &local_19a0;
        local_19a0 = 0;
        local_1990 = 0;
        local_1988 = 0;
        local_1978 = 0;
        local_1974 = 0;
        local_1970 = 0;
        local_196c = 0;
        local_1968 = 0;
        local_1960 = 0;
        local_1998 = 0;
        for (local_19a4 = 0; local_19a4 < local_1548; local_19a4 = local_19a4 + 1) {
          *local_17b8 = *local_1958;
          local_17b8 = local_17b8 + 1;
          local_1958 = local_1958 + local_1544;
        }
        local_1408 = local_14c0;
        local_1980 = local_d08;
      }
      local_13b8 = local_14e8;
    }
    for (local_19a8 = 0; local_19a8 < local_1550; local_19a8 = local_19a8 + 1) {
      local_12e0 = &local_19f8;
      local_bc4 = *(int *)((long)local_1530 + 0x2c);
      local_bc8 = (int)local_1530[6];
      local_bcc = *(undefined4 *)((long)local_1530 + 0x34);
      local_bd8 = (undefined8 *)(*local_1530 + local_1530[8] * (long)local_19a8 * local_1530[2]);
      local_be0 = local_1530[2];
      local_be4 = (undefined4)local_1530[3];
      local_bf0 = local_1530[4];
      local_bc0 = &local_19f8;
      local_b20 = (long)local_bc4 * (long)local_bc8 * local_be0;
      local_760 = &local_19f8;
      local_14b8 = &local_19f8;
      local_b24 = 0x10;
      local_12ec = local_19a8;
      local_12ed = 1;
      local_19f8 = 0;
      local_19e8 = 0;
      local_19e0 = 0;
      local_19d0 = 0;
      local_19cc = 0;
      local_19c8 = 0;
      local_19c4 = 0;
      local_19c0 = 0;
      local_19b8 = 0;
      local_19f0 = 0;
      local_19b0 = local_bd8;
      for (local_19fc = 0; local_19fc + 1 < local_1544; local_19fc = local_19fc + 2) {
        local_131c = local_19fc / 2;
        local_1310 = &local_1a50;
        local_1318 = &local_1598;
        local_ba0 = (long *)((long)local_1598 + local_1558 * local_131c * local_1588);
        local_b88 = &local_1a50;
        local_b30 = (long)local_156c * (long)local_1568 * local_1588;
        local_750 = &local_1a50;
        local_14b0 = &local_1a50;
        local_1220 = &local_1aa0;
        local_ca4 = *(int *)((long)local_1538 + 0x2c);
        local_ca8 = (int)local_1538[6];
        local_cac = *(undefined4 *)((long)local_1538 + 0x34);
        local_cb8 = (long *)(*local_1538 + local_1538[8] * (long)local_19a8 * local_1538[2]);
        local_cc0 = local_1538[2];
        local_cc4 = (undefined4)local_1538[3];
        local_cd0 = local_1538[4];
        local_ca0 = &local_1aa0;
        local_ae0 = (long)local_ca4 * (long)local_ca8 * local_cc0;
        local_820 = &local_1aa0;
        local_14a8 = &local_1aa0;
        local_1a18 = 0;
        local_1a1c = 0;
        local_1a20 = 0;
        local_1a24 = 0;
        local_1a30 = local_1578;
        local_1a38 = 0;
        local_1a40 = 0;
        local_1a48 = 0;
        local_1a50 = 0;
        local_ae4 = 0x10;
        local_b34 = 0x10;
        local_b8c = local_156c;
        local_b90 = local_1568;
        local_b94 = local_1564;
        local_ba8 = local_1588;
        local_bac = local_1580;
        local_bb8 = local_1578;
        local_122c = local_19a8;
        local_122d = 1;
        local_131d = 1;
        local_1a10 = 0;
        local_1a28 = 0;
        local_1aa0 = 0;
        local_1a90 = 0;
        local_1a88 = 0;
        local_1a78 = 0;
        local_1a74 = 0;
        local_1a70 = 0;
        local_1a6c = 0;
        local_1a68 = 0;
        local_1a60 = 0;
        local_1a98 = 0;
        iVar44 = local_154c;
        if (local_154c < 0) {
          iVar44 = local_154c + 3;
        }
        local_1aa4 = (iVar44 >> 2) * local_1548;
        local_1aa8 = (local_154c % 4) * local_1548;
        local_678 = 0;
        uStack_670 = 0;
        local_1ab8 = 0;
        uStack_1ab0 = 0;
        local_688 = 0;
        uStack_680 = 0;
        local_1ac8 = 0;
        uStack_1ac0 = 0;
        local_1a58 = local_cb8;
        local_1a08 = local_ba0;
        if (0 < local_1aa4) {
          local_698 = 0;
          uStack_690 = 0;
          local_1ad8 = 0;
          uStack_1ad0 = 0;
          local_6a8 = 0;
          uStack_6a0 = 0;
          local_1ae8 = 0;
          uStack_1ae0 = 0;
          local_1aec = 0;
          while( true ) {
            iVar42 = (int)local_1ad8;
            iVar43 = (int)uStack_1ad0;
            iVar44 = (int)uStack_1ae0;
            iVar71 = uStack_1ae0._4_4_;
            if (local_1aa4 <= local_1aec) break;
            local_238 = local_1a08;
            local_4f8 = *local_1a08;
            uStack_240 = 0;
            local_6b8 = 0;
            uStack_6b0 = 0;
            local_5b8 = 0;
            uStack_5b0 = 0;
            uStack_5c0 = 0;
            local_5c8._0_1_ = (char)local_4f8;
            local_5c8._1_1_ = (char)((ulong)local_4f8 >> 8);
            local_5c8._2_1_ = (char)((ulong)local_4f8 >> 0x10);
            local_5c8._3_1_ = (char)((ulong)local_4f8 >> 0x18);
            local_5c8._4_1_ = (char)((ulong)local_4f8 >> 0x20);
            local_5c8._5_1_ = (char)((ulong)local_4f8 >> 0x28);
            local_5c8._6_1_ = (char)((ulong)local_4f8 >> 0x30);
            local_5c8._7_1_ = (undefined1)((ulong)local_4f8 >> 0x38);
            local_1b18 = -((char)local_5c8 < '\0');
            cStack_1b17 = -(local_5c8._1_1_ < '\0');
            cStack_1b16 = -(local_5c8._2_1_ < '\0');
            cStack_1b15 = -(local_5c8._3_1_ < '\0');
            cStack_1b14 = -(local_5c8._4_1_ < '\0');
            cStack_1b13 = -(local_5c8._5_1_ < '\0');
            cStack_1b12 = -(local_5c8._6_1_ < '\0');
            cStack_1b11 = -(local_4f8 < 0);
            uStack_1b10 = 0;
            uStack_1b0f = 0;
            uStack_1b0e = 0;
            uStack_1b0d = 0;
            uStack_1b0c = 0;
            uStack_1b0b = 0;
            uStack_1b0a = 0;
            uStack_1b09 = 0;
            uStack_4f0 = 0;
            local_508 = CONCAT17(cStack_1b11,
                                 CONCAT16(cStack_1b12,
                                          CONCAT15(cStack_1b13,
                                                   CONCAT14(cStack_1b14,
                                                            CONCAT13(cStack_1b15,
                                                                     CONCAT12(cStack_1b16,
                                                                              CONCAT11(cStack_1b17,
                                                                                       local_1b18)))
                                                           ))));
            uStack_500 = 0;
            local_1b08 = (char)local_5c8;
            cStack_1b06 = local_5c8._1_1_;
            cStack_1b04 = local_5c8._2_1_;
            cStack_1b02 = local_5c8._3_1_;
            cStack_1b00 = local_5c8._4_1_;
            cStack_1afe = local_5c8._5_1_;
            cStack_1afc = local_5c8._6_1_;
            uStack_1afa = local_5c8._7_1_;
            local_1b28 = CONCAT13(cStack_1b17,
                                  CONCAT12(local_5c8._1_1_,CONCAT11(local_1b18,(char)local_5c8)));
            uStack_1b24 = CONCAT13(cStack_1b15,
                                   CONCAT12(local_5c8._3_1_,CONCAT11(cStack_1b16,local_5c8._2_1_)));
            uVar40 = CONCAT14(cStack_1b13,
                              CONCAT13(local_5c8._5_1_,
                                       CONCAT12(cStack_1b14,CONCAT11(local_5c8._4_1_,cStack_1b15))))
            ;
            Var41 = CONCAT18(cStack_1b11,
                             CONCAT17(local_5c8._7_1_,
                                      CONCAT16(cStack_1b12,CONCAT15(local_5c8._6_1_,uVar40))));
            local_1b38._8_4_ = (undefined4)((uint5)uVar40 >> 8);
            local_1b38._12_4_ = (undefined4)((unkuint9)Var41 >> 0x28);
            local_1b38._0_8_ = (undefined8)((unkuint9)Var41 >> 8);
            local_7c0 = local_1a58;
            local_1b48 = *local_1a58;
            lStack_1b40 = local_1a58[1];
            local_6c8 = 0;
            uStack_6c0 = 0;
            local_5d8 = 0;
            uStack_5d0 = 0;
            local_5e8._0_1_ = (char)local_1b48;
            local_5e8._1_1_ = (char)((ulong)local_1b48 >> 8);
            local_5e8._2_1_ = (char)((ulong)local_1b48 >> 0x10);
            local_5e8._3_1_ = (char)((ulong)local_1b48 >> 0x18);
            local_5e8._4_1_ = (char)((ulong)local_1b48 >> 0x20);
            local_5e8._5_1_ = (char)((ulong)local_1b48 >> 0x28);
            local_5e8._6_1_ = (char)((ulong)local_1b48 >> 0x30);
            local_5e8._7_1_ = (undefined1)((ulong)local_1b48 >> 0x38);
            uStack_5e0._0_1_ = (char)lStack_1b40;
            uStack_5e0._1_1_ = (char)((ulong)lStack_1b40 >> 8);
            uStack_5e0._2_1_ = (char)((ulong)lStack_1b40 >> 0x10);
            uStack_5e0._3_1_ = (char)((ulong)lStack_1b40 >> 0x18);
            uStack_5e0._4_1_ = (char)((ulong)lStack_1b40 >> 0x20);
            uStack_5e0._5_1_ = (char)((ulong)lStack_1b40 >> 0x28);
            uStack_5e0._6_1_ = (char)((ulong)lStack_1b40 >> 0x30);
            uStack_5e0._7_1_ = (undefined1)((ulong)lStack_1b40 >> 0x38);
            cStack_1b67 = -((char)local_5e8 < '\0');
            cStack_1b65 = -(local_5e8._1_1_ < '\0');
            cStack_1b63 = -(local_5e8._2_1_ < '\0');
            cStack_1b61 = -(local_5e8._3_1_ < '\0');
            cStack_1b5f = -(local_5e8._4_1_ < '\0');
            cStack_1b5d = -(local_5e8._5_1_ < '\0');
            cStack_1b5b = -(local_5e8._6_1_ < '\0');
            cStack_1b59 = -(local_1b48 < 0);
            cStack_1b77 = -((char)uStack_5e0 < '\0');
            cStack_1b75 = -(uStack_5e0._1_1_ < '\0');
            cStack_1b73 = -(uStack_5e0._2_1_ < '\0');
            cStack_1b71 = -(uStack_5e0._3_1_ < '\0');
            cStack_1b6f = -(uStack_5e0._4_1_ < '\0');
            cStack_1b6d = -(uStack_5e0._5_1_ < '\0');
            cStack_1b6b = -(uStack_5e0._6_1_ < '\0');
            cStack_1b69 = -(lStack_1b40 < 0);
            local_528 = CONCAT17(cStack_1b59,
                                 CONCAT16(cStack_1b5b,
                                          CONCAT15(cStack_1b5d,
                                                   CONCAT14(cStack_1b5f,
                                                            CONCAT13(cStack_1b61,
                                                                     CONCAT12(cStack_1b63,
                                                                              CONCAT11(cStack_1b65,
                                                                                       cStack_1b67))
                                                                    )))));
            uStack_520 = CONCAT17(cStack_1b69,
                                  CONCAT16(cStack_1b6b,
                                           CONCAT15(cStack_1b6d,
                                                    CONCAT14(cStack_1b6f,
                                                             CONCAT13(cStack_1b71,
                                                                      CONCAT12(cStack_1b73,
                                                                               CONCAT11(cStack_1b75,
                                                                                        cStack_1b77)
                                                                              ))))));
            local_1b68 = (char)local_5e8;
            cStack_1b66 = local_5e8._1_1_;
            cStack_1b64 = local_5e8._2_1_;
            cStack_1b62 = local_5e8._3_1_;
            cStack_1b60 = local_5e8._4_1_;
            cStack_1b5e = local_5e8._5_1_;
            cStack_1b5c = local_5e8._6_1_;
            uStack_1b5a = local_5e8._7_1_;
            local_4c8 = CONCAT17(cStack_1b59,
                                 CONCAT16(cStack_1b5b,
                                          CONCAT15(cStack_1b5d,
                                                   CONCAT14(cStack_1b5f,
                                                            CONCAT13(cStack_1b61,
                                                                     CONCAT12(cStack_1b63,
                                                                              CONCAT11(cStack_1b65,
                                                                                       cStack_1b67))
                                                                    )))));
            uStack_4c0 = CONCAT17(cStack_1b69,
                                  CONCAT16(cStack_1b6b,
                                           CONCAT15(cStack_1b6d,
                                                    CONCAT14(cStack_1b6f,
                                                             CONCAT13(cStack_1b71,
                                                                      CONCAT12(cStack_1b73,
                                                                               CONCAT11(cStack_1b75,
                                                                                        cStack_1b77)
                                                                              ))))));
            local_1b78 = (char)uStack_5e0;
            cStack_1b76 = uStack_5e0._1_1_;
            cStack_1b74 = uStack_5e0._2_1_;
            cStack_1b72 = uStack_5e0._3_1_;
            cStack_1b70 = uStack_5e0._4_1_;
            cStack_1b6e = uStack_5e0._5_1_;
            cStack_1b6c = uStack_5e0._6_1_;
            uStack_1b6a = uStack_5e0._7_1_;
            local_438 = CONCAT44(uStack_1b24,local_1b28);
            uStack_430 = CONCAT44(uStack_1b24,local_1b28);
            local_448 = CONCAT17(cStack_1b61,
                                 CONCAT16(local_5e8._3_1_,
                                          CONCAT15(cStack_1b63,
                                                   CONCAT14(local_5e8._2_1_,
                                                            CONCAT13(cStack_1b65,
                                                                     CONCAT12(local_5e8._1_1_,
                                                                              CONCAT11(cStack_1b67,
                                                                                       (char)
                                                  local_5e8)))))));
            uStack_440 = CONCAT17(cStack_1b59,
                                  CONCAT16(local_5e8._7_1_,
                                           CONCAT15(cStack_1b5b,
                                                    CONCAT14(local_5e8._6_1_,
                                                             CONCAT13(cStack_1b5d,
                                                                      CONCAT12(local_5e8._5_1_,
                                                                               CONCAT11(cStack_1b5f,
                                                                                        local_5e8.
                                                                                        _4_1_)))))))
            ;
            auVar31._8_8_ = uStack_430;
            auVar31._0_8_ = local_438;
            auVar30._8_8_ = uStack_440;
            auVar30._0_8_ = local_448;
            local_848 = pmaddwd(auVar31,auVar30);
            local_858 = local_1ab8;
            uStack_850 = uStack_1ab0;
            local_1ab8 = CONCAT44(local_848._4_4_ + local_1ab8._4_4_,
                                  local_848._0_4_ + (int)local_1ab8);
            uStack_1ab0 = CONCAT44(local_848._12_4_ + uStack_1ab0._4_4_,
                                   local_848._8_4_ + (int)uStack_1ab0);
            local_458 = CONCAT44(uStack_1b24,local_1b28);
            uStack_450 = CONCAT44(uStack_1b24,local_1b28);
            local_468 = CONCAT17(cStack_1b71,
                                 CONCAT16(uStack_5e0._3_1_,
                                          CONCAT15(cStack_1b73,
                                                   CONCAT14(uStack_5e0._2_1_,
                                                            CONCAT13(cStack_1b75,
                                                                     CONCAT12(uStack_5e0._1_1_,
                                                                              CONCAT11(cStack_1b77,
                                                                                       (char)
                                                  uStack_5e0)))))));
            uStack_460 = CONCAT17(cStack_1b69,
                                  CONCAT16(uStack_5e0._7_1_,
                                           CONCAT15(cStack_1b6b,
                                                    CONCAT14(uStack_5e0._6_1_,
                                                             CONCAT13(cStack_1b6d,
                                                                      CONCAT12(uStack_5e0._5_1_,
                                                                               CONCAT11(cStack_1b6f,
                                                                                        uStack_5e0.
                                                                                        _4_1_)))))))
            ;
            auVar29._8_8_ = uStack_450;
            auVar29._0_8_ = local_458;
            auVar28._8_8_ = uStack_460;
            auVar28._0_8_ = local_468;
            local_868 = pmaddwd(auVar29,auVar28);
            local_878 = local_1ad8;
            uStack_870 = uStack_1ad0;
            local_1ad8 = CONCAT44(local_868._4_4_ + local_1ad8._4_4_,
                                  local_868._0_4_ + (int)local_1ad8);
            uStack_1ad0 = CONCAT44(local_868._12_4_ + uStack_1ad0._4_4_,
                                   local_868._8_4_ + (int)uStack_1ad0);
            uStack_470 = local_1b38._8_8_;
            local_488 = CONCAT17(cStack_1b61,
                                 CONCAT16(local_5e8._3_1_,
                                          CONCAT15(cStack_1b63,
                                                   CONCAT14(local_5e8._2_1_,
                                                            CONCAT13(cStack_1b65,
                                                                     CONCAT12(local_5e8._1_1_,
                                                                              CONCAT11(cStack_1b67,
                                                                                       (char)
                                                  local_5e8)))))));
            uStack_480 = CONCAT17(cStack_1b59,
                                  CONCAT16(local_5e8._7_1_,
                                           CONCAT15(cStack_1b5b,
                                                    CONCAT14(local_5e8._6_1_,
                                                             CONCAT13(cStack_1b5d,
                                                                      CONCAT12(local_5e8._5_1_,
                                                                               CONCAT11(cStack_1b5f,
                                                                                        local_5e8.
                                                                                        _4_1_)))))))
            ;
            auVar27._8_8_ = local_1b38._8_8_;
            auVar27._0_8_ = local_1b38._0_8_;
            auVar26._8_8_ = uStack_480;
            auVar26._0_8_ = local_488;
            local_888 = pmaddwd(auVar27,auVar26);
            local_898 = local_1ac8;
            uStack_890 = uStack_1ac0;
            local_1ac8 = CONCAT44(local_888._4_4_ + local_1ac8._4_4_,
                                  local_888._0_4_ + (int)local_1ac8);
            uStack_1ac0 = CONCAT44(local_888._12_4_ + uStack_1ac0._4_4_,
                                   local_888._8_4_ + (int)uStack_1ac0);
            uStack_490 = local_1b38._8_8_;
            local_4a8 = CONCAT17(cStack_1b71,
                                 CONCAT16(uStack_5e0._3_1_,
                                          CONCAT15(cStack_1b73,
                                                   CONCAT14(uStack_5e0._2_1_,
                                                            CONCAT13(cStack_1b75,
                                                                     CONCAT12(uStack_5e0._1_1_,
                                                                              CONCAT11(cStack_1b77,
                                                                                       (char)
                                                  uStack_5e0)))))));
            uStack_4a0 = CONCAT17(cStack_1b69,
                                  CONCAT16(uStack_5e0._7_1_,
                                           CONCAT15(cStack_1b6b,
                                                    CONCAT14(uStack_5e0._6_1_,
                                                             CONCAT13(cStack_1b6d,
                                                                      CONCAT12(uStack_5e0._5_1_,
                                                                               CONCAT11(cStack_1b6f,
                                                                                        uStack_5e0.
                                                                                        _4_1_)))))))
            ;
            auVar25._8_8_ = local_1b38._8_8_;
            auVar25._0_8_ = local_1b38._0_8_;
            auVar49._8_8_ = uStack_4a0;
            auVar49._0_8_ = local_4a8;
            local_8a8 = pmaddwd(auVar25,auVar49);
            local_8b8 = local_1ae8;
            uStack_8b0 = uStack_1ae0;
            local_1ae8 = CONCAT44(local_8a8._4_4_ + local_1ae8._4_4_,
                                  local_8a8._0_4_ + (int)local_1ae8);
            uStack_1ae0 = CONCAT44(local_8a8._12_4_ + uStack_1ae0._4_4_,
                                   local_8a8._8_4_ + (int)uStack_1ae0);
            local_1a08 = local_1a08 + 1;
            local_1a58 = local_1a58 + 2;
            local_1aec = local_1aec + 1;
            local_1b58 = cStack_1b67;
            cStack_1b57 = cStack_1b65;
            cStack_1b56 = cStack_1b63;
            cStack_1b55 = cStack_1b61;
            cStack_1b54 = cStack_1b5f;
            cStack_1b53 = cStack_1b5d;
            cStack_1b52 = cStack_1b5b;
            cStack_1b51 = cStack_1b59;
            cStack_1b50 = cStack_1b77;
            cStack_1b4f = cStack_1b75;
            cStack_1b4e = cStack_1b73;
            cStack_1b4d = cStack_1b71;
            cStack_1b4c = cStack_1b6f;
            cStack_1b4b = cStack_1b6d;
            cStack_1b4a = cStack_1b6b;
            cStack_1b49 = cStack_1b69;
            uStack_1b20 = local_1b28;
            uStack_1b1c = uStack_1b24;
            cStack_1b07 = local_1b18;
            cStack_1b05 = cStack_1b17;
            cStack_1b03 = cStack_1b16;
            cStack_1b01 = cStack_1b15;
            cStack_1aff = cStack_1b14;
            cStack_1afd = cStack_1b13;
            cStack_1afb = cStack_1b12;
            cStack_1af9 = cStack_1b11;
            local_5e8 = local_1b48;
            uStack_5e0 = lStack_1b40;
            local_5c8 = local_4f8;
            local_518 = local_1b48;
            lStack_510 = lStack_1b40;
            local_4b8 = local_1b48;
            lStack_4b0 = lStack_1b40;
            local_498 = local_1b38._0_8_;
            local_478 = local_1b38._0_8_;
            local_248 = local_4f8;
          }
          local_1b88 = (int)local_1ab8;
          iStack_1b84 = (int)uStack_1ab0;
          iStack_1b80 = local_1ab8._4_4_;
          iStack_1b7c = uStack_1ab0._4_4_;
          local_1b98 = (int)local_1ad8;
          iStack_1b94 = (int)uStack_1ad0;
          iStack_1b90 = local_1ad8._4_4_;
          iStack_1b8c = uStack_1ad0._4_4_;
          local_1ba8 = (int)local_1ac8;
          iStack_1ba4 = (int)uStack_1ac0;
          iStack_1ba0 = local_1ac8._4_4_;
          iStack_1b9c = uStack_1ac0._4_4_;
          local_1bb8 = (int)local_1ae8;
          iStack_1bb4 = (int)uStack_1ae0;
          iStack_1bb0 = local_1ae8._4_4_;
          iStack_1bac = uStack_1ae0._4_4_;
          local_8c8 = CONCAT44((int)uStack_1ab0,(int)local_1ab8);
          uStack_330 = CONCAT44(uStack_1ab0._4_4_,local_1ab8._4_4_);
          uStack_8c0 = CONCAT44((int)uStack_1ad0,(int)local_1ad8);
          uStack_340 = CONCAT44(uStack_1ad0._4_4_,local_1ad8._4_4_);
          iStack_2ac = uStack_1ab0._4_4_;
          local_2a8 = CONCAT44(local_2a8._4_4_,
                               CONCAT13(cStack_1b75,
                                        CONCAT12(cStack_1b76,CONCAT11(cStack_1b77,local_1b78))));
          iStack_2bc = uStack_1ad0._4_4_;
          _local_2b8 = CONCAT44((int)uStack_1ab0,(int)local_1ab8);
          uStack_1ad0 = CONCAT44(uStack_1ab0._4_4_,iStack_2b0);
          local_8e8 = CONCAT44((int)uStack_1ac0,(int)local_1ac8);
          uStack_350 = CONCAT44(uStack_1ac0._4_4_,local_1ac8._4_4_);
          uStack_8e0 = CONCAT44((int)uStack_1ae0,(int)local_1ae8);
          uStack_360 = CONCAT44(uStack_1ae0._4_4_,local_1ae8._4_4_);
          local_2e8 = CONCAT44((int)uStack_1ae0,(int)local_1ae8);
          iStack_2cc = uStack_1ac0._4_4_;
          _local_2c8 = CONCAT44(iVar43,(int)local_1ad8);
          iStack_2dc = uStack_1ae0._4_4_;
          _local_2d8 = CONCAT44((int)uStack_1ac0,(int)local_1ac8);
          uStack_1ae0 = CONCAT44(uStack_1ac0._4_4_,iStack_2d0);
          local_1ad8 = CONCAT44(iVar71,iStack_2e0);
          local_8d8 = local_1ad8;
          uStack_8d0 = uStack_1ad0;
          local_1ab8 = CONCAT44((int)uStack_1ab0 + iVar71,(int)local_1ab8 + iStack_2e0);
          uStack_1ab0 = CONCAT44(iVar43 + uStack_1ab0._4_4_,iVar42 + iStack_2b0);
          local_8f8 = local_1ae8;
          uStack_8f0 = uStack_1ae0;
          local_1ac8 = CONCAT44((int)uStack_1ac0 + local_1ae8._4_4_,
                                (int)local_1ac8 + (int)local_1ae8);
          uStack_1ac0 = CONCAT44(iVar44 + uStack_1ac0._4_4_,(int)local_1ae8 + iStack_2d0);
          local_368 = uStack_8e0;
          local_358 = local_8e8;
          local_348 = uStack_8c0;
          local_338 = local_8c8;
        }
        for (local_1bbc = 0; local_1bbc < local_1aa8; local_1bbc = local_1bbc + 1) {
          local_16c = (short)*(char *)((long)local_1a08 + 1);
          local_170 = (short)*(char *)((long)local_1a08 + 1);
          local_174 = (short)(char)*local_1a08;
          local_178 = (short)(char)*local_1a08;
          local_1bd8 = CONCAT26(local_174,CONCAT24(local_174,CONCAT22(local_178,local_178)));
          uStack_1bd0 = CONCAT26(local_16c,CONCAT24(local_16c,CONCAT22(local_170,local_170)));
          local_250 = local_1a58;
          local_538 = *local_1a58;
          uStack_260 = 0;
          local_6d8 = 0;
          uStack_6d0 = 0;
          local_5f8 = 0;
          uStack_5f0 = 0;
          uStack_600 = 0;
          local_608._0_1_ = (char)local_538;
          local_608._1_1_ = (char)((ulong)local_538 >> 8);
          local_608._2_1_ = (char)((ulong)local_538 >> 0x10);
          local_608._3_1_ = (char)((ulong)local_538 >> 0x18);
          local_608._4_1_ = (char)((ulong)local_538 >> 0x20);
          local_608._5_1_ = (char)((ulong)local_538 >> 0x28);
          local_608._6_1_ = (char)((ulong)local_538 >> 0x30);
          local_1bf8 = -((char)local_608 < '\0');
          cStack_1bf7 = -(local_608._1_1_ < '\0');
          cStack_1bf6 = -(local_608._2_1_ < '\0');
          cStack_1bf5 = -(local_608._3_1_ < '\0');
          cStack_1bf4 = -(local_608._4_1_ < '\0');
          cStack_1bf3 = -(local_608._5_1_ < '\0');
          cStack_1bf2 = -(local_608._6_1_ < '\0');
          cStack_1bf1 = -(local_538 < 0);
          uStack_1bf0 = 0;
          uStack_1bef = 0;
          uStack_1bee = 0;
          uStack_1bed = 0;
          uStack_1bec = 0;
          uStack_1beb = 0;
          uStack_1bea = 0;
          uStack_1be9 = 0;
          uStack_530 = 0;
          local_548 = CONCAT17(cStack_1bf1,
                               CONCAT16(cStack_1bf2,
                                        CONCAT15(cStack_1bf3,
                                                 CONCAT14(cStack_1bf4,
                                                          CONCAT13(cStack_1bf5,
                                                                   CONCAT12(cStack_1bf6,
                                                                            CONCAT11(cStack_1bf7,
                                                                                     local_1bf8)))))
                                       ));
          uStack_540 = 0;
          sStack_1c00 = CONCAT11(local_1bf8,(char)local_608);
          uVar10 = CONCAT13(cStack_1bf7,CONCAT12(local_608._1_1_,sStack_1c00));
          uVar11 = CONCAT15(cStack_1bf6,CONCAT14(local_608._2_1_,uVar10));
          uVar1 = CONCAT17(cStack_1bf5,CONCAT16(local_608._3_1_,uVar11));
          local_1be8._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
          local_1be8 = CONCAT44(local_1be8._4_4_,uVar10);
          uStack_1be0 = CONCAT44(local_1be8._4_4_,uVar10);
          local_1c8._2_2_ = (short)((uint)uVar10 >> 0x10);
          local_1c8._4_2_ = (short)((uint6)uVar11 >> 0x20);
          local_1c8._6_2_ = (short)((ulong)uVar1 >> 0x30);
          local_1c08 = local_178 * sStack_1c00;
          sStack_1c06 = local_178 * local_1c8._2_2_;
          sStack_1c04 = local_174 * local_1c8._4_2_;
          sStack_1c02 = local_174 * local_1c8._6_2_;
          sStack_1c00 = local_170 * sStack_1c00;
          sStack_1bfe = local_170 * local_1c8._2_2_;
          sStack_1bfc = local_16c * local_1c8._4_2_;
          sStack_1bfa = local_16c * local_1c8._6_2_;
          auVar39._8_8_ = uStack_1bd0;
          auVar39._0_8_ = local_1bd8;
          auVar38._8_8_ = uStack_1be0;
          auVar38._0_8_ = local_1be8;
          local_1c18 = pmulhw(auVar39,auVar38);
          uVar1 = local_1ab8;
          uVar2 = uStack_1ab0;
          local_78 = CONCAT26(sStack_1c02,CONCAT24(sStack_1c04,CONCAT22(sStack_1c06,local_1c08)));
          uStack_70 = CONCAT26(sStack_1bfa,CONCAT24(sStack_1bfc,CONCAT22(sStack_1bfe,sStack_1c00)));
          uStack_80 = local_1c18._8_8_;
          local_88._0_2_ = local_1c18._0_2_;
          local_88._2_2_ = local_1c18._2_2_;
          local_88._4_2_ = local_1c18._4_2_;
          local_88._6_2_ = local_1c18._6_2_;
          local_918 = CONCAT22((undefined2)local_88,local_1c08);
          uStack_914 = CONCAT22(local_88._2_2_,sStack_1c06);
          uStack_910 = CONCAT22(local_88._4_2_,sStack_1c04);
          uStack_90c = CONCAT22(local_88._6_2_,sStack_1c02);
          local_908._0_4_ = (int)local_1ab8;
          local_908._4_4_ = (int)((ulong)local_1ab8 >> 0x20);
          uStack_900._0_4_ = (int)uStack_1ab0;
          uStack_900._4_4_ = (int)((ulong)uStack_1ab0 >> 0x20);
          local_1ab8 = CONCAT44(local_908._4_4_ + uStack_914,(int)local_908 + local_918);
          uStack_1ab0 = CONCAT44(uStack_900._4_4_ + uStack_90c,(int)uStack_900 + uStack_910);
          uVar3 = local_1ac8;
          uVar4 = uStack_1ac0;
          local_18 = CONCAT26(sStack_1c02,CONCAT24(sStack_1c04,CONCAT22(sStack_1c06,local_1c08)));
          uStack_10 = CONCAT26(sStack_1bfa,CONCAT24(sStack_1bfc,CONCAT22(sStack_1bfe,sStack_1c00)));
          local_28 = local_1c18._0_8_;
          uStack_20 = local_1c18._8_8_;
          local_938 = CONCAT22(local_1c18._8_2_,sStack_1c00);
          uStack_934 = CONCAT22(local_1c18._10_2_,sStack_1bfe);
          uStack_930 = CONCAT22(local_1c18._12_2_,sStack_1bfc);
          uStack_92c = CONCAT22(local_1c18._14_2_,sStack_1bfa);
          local_928._0_4_ = (int)local_1ac8;
          local_928._4_4_ = (int)((ulong)local_1ac8 >> 0x20);
          uStack_920._0_4_ = (int)uStack_1ac0;
          uStack_920._4_4_ = (int)((ulong)uStack_1ac0 >> 0x20);
          local_1ac8 = CONCAT44(local_928._4_4_ + uStack_934,(int)local_928 + local_938);
          uStack_1ac0 = CONCAT44(uStack_920._4_4_ + uStack_92c,(int)uStack_920 + uStack_930);
          local_1a08 = (long *)((long)local_1a08 + 2);
          local_1a58 = (long *)((long)local_1a58 + 4);
          local_928 = uVar3;
          uStack_920 = uVar4;
          local_908 = uVar1;
          uStack_900 = uVar2;
          local_608 = local_538;
          local_268 = local_538;
          local_1c8 = local_1be8;
          uStack_1c0 = uStack_1be0;
          local_1b8 = local_1bd8;
          uStack_1b0 = uStack_1bd0;
          local_188 = local_1bd8;
          uStack_180 = uStack_1bd0;
          local_176 = local_178;
          local_172 = local_174;
          local_16e = local_170;
          local_16a = local_16c;
          local_108 = local_1be8;
          uStack_100 = uStack_1be0;
          local_f8 = local_1bd8;
          uStack_f0 = uStack_1bd0;
          local_88 = local_1c18._0_8_;
        }
        local_768 = local_19b0;
        local_778 = local_1ab8;
        uStack_770 = uStack_1ab0;
        *local_19b0 = local_1ab8;
        local_19b0[1] = uStack_1ab0;
        local_780 = local_19b0 + 2;
        local_798 = local_1ac8;
        uStack_790 = uStack_1ac0;
        *local_780 = local_1ac8;
        local_19b0[3] = uStack_1ac0;
        local_19b0 = local_19b0 + 4;
        local_1438 = local_14a8;
        local_1428 = local_14b0;
        local_1a80 = local_cd0;
      }
      for (; local_19fc < local_1544; local_19fc = local_19fc + 1) {
        local_134c = local_19fc / 2 + local_19fc % 2;
        local_1340 = &local_1c68;
        local_1348 = &local_1598;
        local_b68 = (long *)((long)local_1598 + local_1558 * local_134c * local_1588);
        local_b50 = &local_1c68;
        local_b40 = (long)local_156c * (long)local_1568 * local_1588;
        local_758 = &local_1c68;
        local_14a0 = &local_1c68;
        local_1250 = &local_1cb8;
        local_c6c = *(int *)((long)local_1538 + 0x2c);
        local_c70 = (int)local_1538[6];
        local_c74 = *(undefined4 *)((long)local_1538 + 0x34);
        local_c80 = (long *)(*local_1538 + local_1538[8] * (long)local_19a8 * local_1538[2]);
        local_c88 = local_1538[2];
        local_c8c = (undefined4)local_1538[3];
        local_c98 = local_1538[4];
        local_c68 = &local_1cb8;
        local_af0 = (long)local_c6c * (long)local_c70 * local_c88;
        local_1c30 = 0;
        local_1c34 = 0;
        local_1c38 = 0;
        local_1c3c = 0;
        local_1c48 = local_1578;
        local_1c50 = 0;
        local_1c58 = 0;
        local_1c60 = 0;
        local_1c68 = 0;
        local_af4 = 0x10;
        local_b44 = 0x10;
        local_b54 = local_156c;
        local_b58 = local_1568;
        local_b5c = local_1564;
        local_b70 = local_1588;
        local_b74 = local_1580;
        local_b80 = local_1578;
        local_125c = local_19a8;
        local_125d = 1;
        local_134d = 1;
        local_1c28 = 0;
        local_1c40 = 0;
        local_828 = &local_1cb8;
        local_1498 = &local_1cb8;
        local_1cb8 = 0;
        local_1ca8 = 0;
        local_1ca0 = 0;
        local_1c90 = 0;
        local_1c8c = 0;
        local_1c88 = 0;
        local_1c84 = 0;
        local_1c80 = 0;
        local_1c78 = 0;
        local_1cb0 = 0;
        iVar44 = local_154c;
        if (local_154c < 0) {
          iVar44 = local_154c + 3;
        }
        iVar44 = (iVar44 >> 2) * local_1548;
        local_6e8 = 0;
        uStack_6e0 = 0;
        local_1cd8 = 0;
        uStack_1cd0 = 0;
        local_1c70 = local_c80;
        local_1c20 = local_b68;
        if (0 < iVar44) {
          local_6f8 = 0;
          uStack_6f0 = 0;
          local_1ce8 = 0;
          uStack_1ce0 = 0;
          local_708 = 0;
          uStack_700 = 0;
          local_1cf8 = 0;
          uStack_1cf0 = 0;
          local_718 = 0;
          uStack_710 = 0;
          local_1d08 = 0;
          uStack_1d00 = 0;
          local_1d0c = 0;
          while( true ) {
            uVar8 = uStack_940;
            uVar7 = local_948;
            uVar6 = uStack_960;
            uVar5 = local_968;
            uVar4 = uStack_980;
            uVar3 = local_988;
            uVar2 = uStack_9a0;
            uVar1 = local_9a8;
            local_948._0_4_ = (int)local_1cd8;
            local_948._4_4_ = (int)((ulong)local_1cd8 >> 0x20);
            uStack_940._0_4_ = (int)uStack_1cd0;
            uStack_940._4_4_ = (int)((ulong)uStack_1cd0 >> 0x20);
            local_968._0_4_ = (int)local_1ce8;
            local_968._4_4_ = (int)((ulong)local_1ce8 >> 0x20);
            uStack_960._0_4_ = (int)uStack_1ce0;
            uStack_960._4_4_ = (int)((ulong)uStack_1ce0 >> 0x20);
            local_988._0_4_ = (int)local_1cf8;
            local_988._4_4_ = (int)((ulong)local_1cf8 >> 0x20);
            uStack_980._0_4_ = (int)uStack_1cf0;
            uStack_980._4_4_ = (int)((ulong)uStack_1cf0 >> 0x20);
            local_9a8._0_4_ = (int)local_1d08;
            local_9a8._4_4_ = (int)((ulong)local_1d08 >> 0x20);
            uStack_9a0._0_4_ = (int)uStack_1d00;
            uStack_9a0._4_4_ = (int)((ulong)uStack_1d00 >> 0x20);
            if (iVar44 <= local_1d0c) break;
            local_270 = local_1c20;
            local_558 = *local_1c20;
            uStack_280 = 0;
            local_728 = 0;
            uStack_720 = 0;
            local_618 = 0;
            uStack_610 = 0;
            uStack_620 = 0;
            local_628._0_1_ = (char)local_558;
            local_628._1_1_ = (char)((ulong)local_558 >> 8);
            local_628._2_1_ = (char)((ulong)local_558 >> 0x10);
            local_628._3_1_ = (char)((ulong)local_558 >> 0x18);
            local_628._4_1_ = (char)((ulong)local_558 >> 0x20);
            local_628._5_1_ = (char)((ulong)local_558 >> 0x28);
            local_628._6_1_ = (char)((ulong)local_558 >> 0x30);
            cVar67 = -(local_628._1_1_ < '\0');
            cVar68 = -(local_628._2_1_ < '\0');
            cVar69 = -(local_628._3_1_ < '\0');
            uStack_550 = 0;
            local_568 = CONCAT17(-(local_558 < 0),
                                 CONCAT16(-(local_628._6_1_ < '\0'),
                                          CONCAT15(-(local_628._5_1_ < '\0'),
                                                   CONCAT14(-(local_628._4_1_ < '\0'),
                                                            CONCAT13(cVar69,CONCAT12(cVar68,CONCAT11
                                                  (cVar67,-((char)local_628 < '\0'))))))));
            uStack_560 = 0;
            sVar48 = CONCAT11(-((char)local_628 < '\0'),(char)local_628);
            local_7c8 = local_1c70;
            local_578 = *local_1c70;
            lStack_570 = local_1c70[1];
            local_738 = 0;
            uStack_730 = 0;
            local_638 = 0;
            uStack_630 = 0;
            local_648._0_1_ = (char)local_578;
            local_648._1_1_ = (char)((ulong)local_578 >> 8);
            local_648._2_1_ = (char)((ulong)local_578 >> 0x10);
            local_648._3_1_ = (char)((ulong)local_578 >> 0x18);
            local_648._4_1_ = (char)((ulong)local_578 >> 0x20);
            local_648._5_1_ = (char)((ulong)local_578 >> 0x28);
            local_648._6_1_ = (char)((ulong)local_578 >> 0x30);
            local_648._7_1_ = (undefined1)((ulong)local_578 >> 0x38);
            uStack_640._0_1_ = (char)lStack_570;
            uStack_640._1_1_ = (char)((ulong)lStack_570 >> 8);
            uStack_640._2_1_ = (char)((ulong)lStack_570 >> 0x10);
            uStack_640._3_1_ = (char)((ulong)lStack_570 >> 0x18);
            uStack_640._4_1_ = (char)((ulong)lStack_570 >> 0x20);
            uStack_640._5_1_ = (char)((ulong)lStack_570 >> 0x28);
            uStack_640._6_1_ = (char)((ulong)lStack_570 >> 0x30);
            uStack_640._7_1_ = (undefined1)((ulong)lStack_570 >> 0x38);
            cVar45 = -((char)local_648 < '\0');
            cVar50 = -(local_648._1_1_ < '\0');
            cVar51 = -(local_648._2_1_ < '\0');
            cVar52 = -(local_648._3_1_ < '\0');
            cVar53 = -(local_648._4_1_ < '\0');
            cVar54 = -(local_648._5_1_ < '\0');
            cVar55 = -(local_648._6_1_ < '\0');
            cVar56 = -(local_578 < 0);
            cVar57 = -((char)uStack_640 < '\0');
            cVar60 = -(uStack_640._1_1_ < '\0');
            cVar61 = -(uStack_640._2_1_ < '\0');
            cVar62 = -(uStack_640._3_1_ < '\0');
            cVar63 = -(uStack_640._4_1_ < '\0');
            cVar64 = -(uStack_640._5_1_ < '\0');
            cVar65 = -(uStack_640._6_1_ < '\0');
            cVar66 = -(lStack_570 < 0);
            local_588 = CONCAT17(cVar56,CONCAT16(cVar55,CONCAT15(cVar54,CONCAT14(cVar53,CONCAT13(
                                                  cVar52,CONCAT12(cVar51,CONCAT11(cVar50,cVar45)))))
                                                ));
            uStack_580 = CONCAT17(cVar66,CONCAT16(cVar65,CONCAT15(cVar64,CONCAT14(cVar63,CONCAT13(
                                                  cVar62,CONCAT12(cVar61,CONCAT11(cVar60,cVar57)))))
                                                 ));
            local_4e8 = CONCAT17(cVar56,CONCAT16(cVar55,CONCAT15(cVar54,CONCAT14(cVar53,CONCAT13(
                                                  cVar52,CONCAT12(cVar51,CONCAT11(cVar50,cVar45)))))
                                                ));
            uStack_4e0 = CONCAT17(cVar66,CONCAT16(cVar65,CONCAT15(cVar64,CONCAT14(cVar63,CONCAT13(
                                                  cVar62,CONCAT12(cVar61,CONCAT11(cVar60,cVar57)))))
                                                 ));
            uVar18 = CONCAT13(cVar67,CONCAT12(local_628._1_1_,sVar48));
            uVar19 = CONCAT15(cVar68,CONCAT14(local_628._2_1_,uVar18));
            uVar17 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,uVar19));
            uVar22 = CONCAT13(cVar67,CONCAT12(local_628._1_1_,sVar48));
            uVar23 = CONCAT15(cVar68,CONCAT14(local_628._2_1_,uVar22));
            uVar21 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,uVar23));
            uVar10 = CONCAT13(cVar50,CONCAT12(local_648._1_1_,CONCAT11(cVar45,(char)local_648)));
            uVar11 = CONCAT15(cVar51,CONCAT14(local_648._2_1_,uVar10));
            uVar15 = CONCAT17(cVar52,CONCAT16(local_648._3_1_,uVar11));
            uVar13 = CONCAT13(cVar54,CONCAT12(local_648._5_1_,CONCAT11(cVar53,local_648._4_1_)));
            uVar14 = CONCAT15(cVar55,CONCAT14(local_648._6_1_,uVar13));
            uVar16 = CONCAT17(cVar56,CONCAT16(local_648._7_1_,uVar14));
            local_1d8._2_2_ = (short)((uint)uVar18 >> 0x10);
            local_1d8._4_2_ = (short)((uint6)uVar19 >> 0x20);
            local_1d8._6_2_ = (short)((ulong)uVar17 >> 0x30);
            uStack_1d0._2_2_ = (short)((uint)uVar22 >> 0x10);
            uStack_1d0._4_2_ = (short)((uint6)uVar23 >> 0x20);
            uStack_1d0._6_2_ = (short)((ulong)uVar21 >> 0x30);
            local_1e8._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_1e8._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_1e8._6_2_ = (short)((ulong)uVar15 >> 0x30);
            uStack_1e0._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_1e0._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_1e0._6_2_ = (short)((ulong)uVar16 >> 0x30);
            sVar46 = sVar48 * CONCAT11(cVar45,(char)local_648);
            local_1d8._2_2_ = local_1d8._2_2_ * local_1e8._2_2_;
            local_1d8._4_2_ = local_1d8._4_2_ * local_1e8._4_2_;
            local_1d8._6_2_ = local_1d8._6_2_ * local_1e8._6_2_;
            sVar58 = sVar48 * CONCAT11(cVar53,local_648._4_1_);
            uStack_1d0._2_2_ = uStack_1d0._2_2_ * uStack_1e0._2_2_;
            uStack_1d0._4_2_ = uStack_1d0._4_2_ * uStack_1e0._4_2_;
            uStack_1d0._6_2_ = uStack_1d0._6_2_ * uStack_1e0._6_2_;
            local_118 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,
                                                 CONCAT15(cVar68,CONCAT14(local_628._2_1_,
                                                                          CONCAT13(cVar67,CONCAT12(
                                                  local_628._1_1_,sVar48))))));
            uStack_110 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,
                                                  CONCAT15(cVar68,CONCAT14(local_628._2_1_,
                                                                           CONCAT13(cVar67,CONCAT12(
                                                  local_628._1_1_,sVar48))))));
            local_128 = CONCAT17(cVar52,CONCAT16(local_648._3_1_,
                                                 CONCAT15(cVar51,CONCAT14(local_648._2_1_,
                                                                          CONCAT13(cVar50,CONCAT12(
                                                  local_648._1_1_,CONCAT11(cVar45,(char)local_648)))
                                                  ))));
            uStack_120 = CONCAT17(cVar56,CONCAT16(local_648._7_1_,
                                                  CONCAT15(cVar55,CONCAT14(local_648._6_1_,
                                                                           CONCAT13(cVar54,CONCAT12(
                                                  local_648._5_1_,CONCAT11(cVar53,local_648._4_1_)))
                                                  ))));
            auVar37._8_8_ = uStack_110;
            auVar37._0_8_ = local_118;
            auVar36._8_8_ = uStack_120;
            auVar36._0_8_ = local_128;
            auVar49 = pmulhw(auVar37,auVar36);
            uVar18 = CONCAT13(cVar67,CONCAT12(local_628._1_1_,sVar48));
            uVar19 = CONCAT15(cVar68,CONCAT14(local_628._2_1_,uVar18));
            uVar20 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,uVar19));
            uVar22 = CONCAT13(cVar67,CONCAT12(local_628._1_1_,sVar48));
            uVar23 = CONCAT15(cVar68,CONCAT14(local_628._2_1_,uVar22));
            uVar24 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,uVar23));
            uVar10 = CONCAT13(cVar60,CONCAT12(uStack_640._1_1_,CONCAT11(cVar57,(char)uStack_640)));
            uVar11 = CONCAT15(cVar61,CONCAT14(uStack_640._2_1_,uVar10));
            uVar9 = CONCAT17(cVar62,CONCAT16(uStack_640._3_1_,uVar11));
            uVar13 = CONCAT13(cVar64,CONCAT12(uStack_640._5_1_,CONCAT11(cVar63,uStack_640._4_1_)));
            uVar14 = CONCAT15(cVar65,CONCAT14(uStack_640._6_1_,uVar13));
            uVar12 = CONCAT17(cVar66,CONCAT16(uStack_640._7_1_,uVar14));
            local_1f8._2_2_ = (short)((uint)uVar18 >> 0x10);
            local_1f8._4_2_ = (short)((uint6)uVar19 >> 0x20);
            local_1f8._6_2_ = (short)((ulong)uVar20 >> 0x30);
            uStack_1f0._2_2_ = (short)((uint)uVar22 >> 0x10);
            uStack_1f0._4_2_ = (short)((uint6)uVar23 >> 0x20);
            uStack_1f0._6_2_ = (short)((ulong)uVar24 >> 0x30);
            local_208._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_208._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_208._6_2_ = (short)((ulong)uVar9 >> 0x30);
            uStack_200._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_200._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_200._6_2_ = (short)((ulong)uVar12 >> 0x30);
            sVar47 = sVar48 * CONCAT11(cVar57,(char)uStack_640);
            local_1f8._2_2_ = local_1f8._2_2_ * local_208._2_2_;
            local_1f8._4_2_ = local_1f8._4_2_ * local_208._4_2_;
            local_1f8._6_2_ = local_1f8._6_2_ * local_208._6_2_;
            sVar59 = sVar48 * CONCAT11(cVar63,uStack_640._4_1_);
            uStack_1f0._2_2_ = uStack_1f0._2_2_ * uStack_200._2_2_;
            uStack_1f0._4_2_ = uStack_1f0._4_2_ * uStack_200._4_2_;
            uStack_1f0._6_2_ = uStack_1f0._6_2_ * uStack_200._6_2_;
            local_138 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,
                                                 CONCAT15(cVar68,CONCAT14(local_628._2_1_,
                                                                          CONCAT13(cVar67,CONCAT12(
                                                  local_628._1_1_,sVar48))))));
            uStack_130 = CONCAT17(cVar69,CONCAT16(local_628._3_1_,
                                                  CONCAT15(cVar68,CONCAT14(local_628._2_1_,
                                                                           CONCAT13(cVar67,CONCAT12(
                                                  local_628._1_1_,sVar48))))));
            local_148 = CONCAT17(cVar62,CONCAT16(uStack_640._3_1_,
                                                 CONCAT15(cVar61,CONCAT14(uStack_640._2_1_,
                                                                          CONCAT13(cVar60,CONCAT12(
                                                  uStack_640._1_1_,CONCAT11(cVar57,(char)uStack_640)
                                                  ))))));
            uStack_140 = CONCAT17(cVar66,CONCAT16(uStack_640._7_1_,
                                                  CONCAT15(cVar65,CONCAT14(uStack_640._6_1_,
                                                                           CONCAT13(cVar64,CONCAT12(
                                                  uStack_640._5_1_,CONCAT11(cVar63,uStack_640._4_1_)
                                                  ))))));
            auVar35._8_8_ = uStack_130;
            auVar35._0_8_ = local_138;
            auVar34._8_8_ = uStack_140;
            auVar34._0_8_ = local_148;
            local_1dc8 = pmulhw(auVar35,auVar34);
            uVar1 = local_1cd8;
            uVar2 = uStack_1cd0;
            local_98 = CONCAT26(local_1d8._6_2_,
                                CONCAT24(local_1d8._4_2_,CONCAT22(local_1d8._2_2_,sVar46)));
            uStack_90 = CONCAT26(uStack_1d0._6_2_,
                                 CONCAT24(uStack_1d0._4_2_,CONCAT22(uStack_1d0._2_2_,sVar58)));
            local_1da8 = auVar49._0_8_;
            uStack_1da0 = auVar49._8_8_;
            uStack_a0 = uStack_1da0;
            local_a8._0_2_ = auVar49._0_2_;
            local_a8._2_2_ = auVar49._2_2_;
            local_a8._4_2_ = auVar49._4_2_;
            local_a8._6_2_ = auVar49._6_2_;
            local_958 = CONCAT22((undefined2)local_a8,sVar46);
            uStack_954 = CONCAT22(local_a8._2_2_,local_1d8._2_2_);
            uStack_950 = CONCAT22(local_a8._4_2_,local_1d8._4_2_);
            uStack_94c = CONCAT22(local_a8._6_2_,local_1d8._6_2_);
            local_1cd8 = CONCAT44(local_948._4_4_ + uStack_954,(int)local_948 + local_958);
            uStack_1cd0 = CONCAT44(uStack_940._4_4_ + uStack_94c,(int)uStack_940 + uStack_950);
            uVar3 = local_1ce8;
            uVar4 = uStack_1ce0;
            local_38 = CONCAT26(local_1d8._6_2_,
                                CONCAT24(local_1d8._4_2_,CONCAT22(local_1d8._2_2_,sVar46)));
            uStack_30 = CONCAT26(uStack_1d0._6_2_,
                                 CONCAT24(uStack_1d0._4_2_,CONCAT22(uStack_1d0._2_2_,sVar58)));
            local_48 = local_1da8;
            uStack_40._0_2_ = auVar49._8_2_;
            uStack_40._2_2_ = auVar49._10_2_;
            uStack_40._4_2_ = auVar49._12_2_;
            uStack_40._6_2_ = auVar49._14_2_;
            local_978 = CONCAT22((undefined2)uStack_40,sVar58);
            uStack_974 = CONCAT22(uStack_40._2_2_,uStack_1d0._2_2_);
            uStack_970 = CONCAT22(uStack_40._4_2_,uStack_1d0._4_2_);
            uStack_96c = CONCAT22(uStack_40._6_2_,uStack_1d0._6_2_);
            local_1ce8 = CONCAT44(local_968._4_4_ + uStack_974,(int)local_968 + local_978);
            uStack_1ce0 = CONCAT44(uStack_960._4_4_ + uStack_96c,(int)uStack_960 + uStack_970);
            uVar5 = local_1cf8;
            uVar6 = uStack_1cf0;
            local_b8 = CONCAT26(local_1f8._6_2_,
                                CONCAT24(local_1f8._4_2_,CONCAT22(local_1f8._2_2_,sVar47)));
            uStack_b0 = CONCAT26(uStack_1f0._6_2_,
                                 CONCAT24(uStack_1f0._4_2_,CONCAT22(uStack_1f0._2_2_,sVar59)));
            uStack_c0 = local_1dc8._8_8_;
            local_c8._0_2_ = local_1dc8._0_2_;
            local_c8._2_2_ = local_1dc8._2_2_;
            local_c8._4_2_ = local_1dc8._4_2_;
            local_c8._6_2_ = local_1dc8._6_2_;
            local_998 = CONCAT22((undefined2)local_c8,sVar47);
            uStack_994 = CONCAT22(local_c8._2_2_,local_1f8._2_2_);
            uStack_990 = CONCAT22(local_c8._4_2_,local_1f8._4_2_);
            uStack_98c = CONCAT22(local_c8._6_2_,local_1f8._6_2_);
            local_1cf8 = CONCAT44(local_988._4_4_ + uStack_994,(int)local_988 + local_998);
            uStack_1cf0 = CONCAT44(uStack_980._4_4_ + uStack_98c,(int)uStack_980 + uStack_990);
            uVar7 = local_1d08;
            uVar8 = uStack_1d00;
            local_58 = CONCAT26(local_1f8._6_2_,
                                CONCAT24(local_1f8._4_2_,CONCAT22(local_1f8._2_2_,sVar47)));
            uStack_50 = CONCAT26(uStack_1f0._6_2_,
                                 CONCAT24(uStack_1f0._4_2_,CONCAT22(uStack_1f0._2_2_,sVar59)));
            local_68 = local_1dc8._0_8_;
            uStack_60 = local_1dc8._8_8_;
            local_9b8 = CONCAT22(local_1dc8._8_2_,sVar59);
            uStack_9b4 = CONCAT22(local_1dc8._10_2_,uStack_1f0._2_2_);
            uStack_9b0 = CONCAT22(local_1dc8._12_2_,uStack_1f0._4_2_);
            uStack_9ac = CONCAT22(local_1dc8._14_2_,uStack_1f0._6_2_);
            local_1d08 = CONCAT44(local_9a8._4_4_ + uStack_9b4,(int)local_9a8 + local_9b8);
            uStack_1d00 = CONCAT44(uStack_9a0._4_4_ + uStack_9ac,(int)uStack_9a0 + uStack_9b0);
            local_1c20 = (long *)((long)local_1c20 + 4);
            local_1c70 = local_1c70 + 2;
            local_1d0c = local_1d0c + 1;
            local_9a8 = uVar7;
            uStack_9a0 = uVar8;
            local_988 = uVar5;
            uStack_980 = uVar6;
            local_968 = uVar3;
            uStack_960 = uVar4;
            local_948 = uVar1;
            uStack_940 = uVar2;
            local_648 = local_578;
            uStack_640 = lStack_570;
            local_628 = local_558;
            local_4d8 = local_578;
            lStack_4d0 = lStack_570;
            local_288 = local_558;
            local_208 = uVar9;
            uStack_200 = uVar12;
            local_1f8 = uVar20;
            uStack_1f0 = uVar24;
            local_1e8 = uVar15;
            uStack_1e0 = uVar16;
            local_1d8 = uVar17;
            uStack_1d0 = uVar21;
            local_c8 = local_1dc8._0_8_;
            local_a8 = local_1da8;
            uStack_40 = uStack_1da0;
          }
          local_3f8 = local_1cd8;
          uStack_3f0 = uStack_1cd0;
          local_408 = local_1ce8;
          uStack_400 = uStack_1ce0;
          local_418 = local_1cf8;
          uStack_410 = uStack_1cf0;
          local_428 = local_1d08;
          uStack_420 = uStack_1d00;
          local_3b8 = local_1cd8;
          uStack_3b0 = uStack_1cd0;
          local_3c8 = local_1ce8;
          uStack_3c0 = uStack_1ce0;
          local_3d8 = local_1cf8;
          uStack_3d0 = uStack_1cf0;
          local_3e8 = local_1d08;
          uStack_3e0 = uStack_1d00;
          local_378 = CONCAT44((int)local_968,(int)local_948);
          uStack_370 = CONCAT44(local_968._4_4_,local_948._4_4_);
          uStack_9c0 = CONCAT44((int)local_9a8,(int)local_988);
          uStack_380 = CONCAT44(local_9a8._4_4_,local_988._4_4_);
          iStack_2ec = local_968._4_4_;
          local_2e8 = CONCAT44(local_2e8._4_4_,local_1dc8._0_4_);
          iStack_2fc = local_9a8._4_4_;
          _local_2f8 = CONCAT44((int)local_968,(int)local_948);
          uStack_1ce0 = CONCAT44(local_968._4_4_,iStack_2f0);
          local_1cd8 = CONCAT44(local_9a8._4_4_,iStack_300);
          local_398 = CONCAT44((int)uStack_960,(int)uStack_940);
          uStack_390 = CONCAT44(uStack_960._4_4_,uStack_940._4_4_);
          uStack_9e0 = CONCAT44((int)uStack_9a0,(int)uStack_980);
          uStack_3a0 = CONCAT44(uStack_9a0._4_4_,uStack_980._4_4_);
          local_328 = CONCAT44((int)uStack_9a0,(int)uStack_980);
          iStack_30c = uStack_960._4_4_;
          _local_308 = CONCAT44((int)local_9a8,(int)local_988);
          iStack_31c = uStack_9a0._4_4_;
          _local_318 = CONCAT44((int)uStack_960,(int)uStack_940);
          uStack_1d00 = CONCAT44(uStack_960._4_4_,iStack_310);
          local_1cf8 = CONCAT44(uStack_9a0._4_4_,iStack_320);
          local_9c8 = local_1cd8;
          local_9d8 = local_1ce8;
          uStack_9d0 = uStack_1ce0;
          local_1cd8 = CONCAT44(local_9a8._4_4_ + local_968._4_4_,iStack_300 + (int)local_968);
          uStack_1cd0 = CONCAT44((int)local_9a8 + local_968._4_4_,(int)local_988 + iStack_2f0);
          local_9e8 = local_1cf8;
          local_9f8 = local_1d08;
          uStack_9f0 = uStack_1d00;
          local_1cf8 = CONCAT44(uStack_9a0._4_4_ + local_9a8._4_4_,iStack_320 + (int)local_9a8);
          uStack_1cf0 = CONCAT44((int)uStack_9a0 + uStack_960._4_4_,(int)uStack_980 + iStack_310);
          local_a08 = local_1cd8;
          uStack_a00 = uStack_1cd0;
          local_a18 = local_1cf8;
          uStack_a10 = uStack_1cf0;
          local_1cd8 = CONCAT44(local_9a8._4_4_ + local_968._4_4_ +
                                uStack_9a0._4_4_ + local_9a8._4_4_,
                                iStack_300 + (int)local_968 + iStack_320 + (int)local_9a8);
          uStack_1cd0 = CONCAT44((int)local_9a8 + local_968._4_4_ +
                                 (int)uStack_9a0 + uStack_960._4_4_,
                                 (int)local_988 + iStack_2f0 + (int)uStack_980 + iStack_310);
          local_9a8 = uVar1;
          uStack_9a0 = uVar2;
          local_988 = uVar3;
          uStack_980 = uVar4;
          local_968 = uVar5;
          uStack_960 = uVar6;
          local_948 = uVar7;
          uStack_940 = uVar8;
          local_3a8 = uStack_9e0;
          local_388 = uStack_9c0;
        }
        for (local_1e0c = 0; local_1e0c < (local_154c % 4) * local_1548; local_1e0c = local_1e0c + 1
            ) {
          local_22a = (short)(char)*local_1c20;
          local_218 = CONCAT26(local_22a,CONCAT24(local_22a,CONCAT22(local_22a,local_22a)));
          uStack_210 = CONCAT26(local_22a,CONCAT24(local_22a,CONCAT22(local_22a,local_22a)));
          local_290 = local_1c70;
          local_598 = *local_1c70;
          uStack_2a0 = 0;
          local_748 = 0;
          uStack_740 = 0;
          local_658 = 0;
          uStack_650 = 0;
          uStack_660 = 0;
          local_668._0_1_ = (char)local_598;
          local_668._1_1_ = (char)((ulong)local_598 >> 8);
          local_668._2_1_ = (char)((ulong)local_598 >> 0x10);
          local_668._3_1_ = (char)((ulong)local_598 >> 0x18);
          local_668._4_1_ = (char)((ulong)local_598 >> 0x20);
          local_668._5_1_ = (char)((ulong)local_598 >> 0x28);
          local_668._6_1_ = (char)((ulong)local_598 >> 0x30);
          local_668._7_1_ = (undefined1)((ulong)local_598 >> 0x38);
          uStack_590 = 0;
          local_5a8 = CONCAT17(-(local_598 < 0),
                               CONCAT16(-(local_668._6_1_ < '\0'),
                                        CONCAT15(-(local_668._5_1_ < '\0'),
                                                 CONCAT14(-(local_668._4_1_ < '\0'),
                                                          CONCAT13(-(local_668._3_1_ < '\0'),
                                                                   CONCAT12(-(local_668._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_668.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_668 < '\0'))))))));
          uStack_5a0 = 0;
          sVar48 = CONCAT11(-((char)local_668 < '\0'),(char)local_668);
          uVar10 = CONCAT13(-(local_668._1_1_ < '\0'),CONCAT12(local_668._1_1_,sVar48));
          uVar11 = CONCAT15(-(local_668._2_1_ < '\0'),CONCAT14(local_668._2_1_,uVar10));
          local_168 = CONCAT17(-(local_668._3_1_ < '\0'),CONCAT16(local_668._3_1_,uVar11));
          uStack_1e30._0_2_ = CONCAT11(-(local_668._4_1_ < '\0'),local_668._4_1_);
          uStack_1e30._0_4_ =
               CONCAT13(-(local_668._5_1_ < '\0'),CONCAT12(local_668._5_1_,(short)uStack_1e30));
          uStack_1e30._0_6_ =
               CONCAT15(-(local_668._6_1_ < '\0'),CONCAT14(local_668._6_1_,(undefined4)uStack_1e30))
          ;
          uStack_1e30 = CONCAT17(-(local_598 < 0),CONCAT16(local_668._7_1_,(undefined6)uStack_1e30))
          ;
          local_228._2_2_ = (short)((uint)uVar10 >> 0x10);
          local_228._4_2_ = (short)((uint6)uVar11 >> 0x20);
          local_228._6_2_ = (short)((ulong)local_168 >> 0x30);
          uStack_220._2_2_ = (short)((uint)(undefined4)uStack_1e30 >> 0x10);
          uStack_220._4_2_ = (short)((uint6)(undefined6)uStack_1e30 >> 0x20);
          uStack_220._6_2_ = (short)((ulong)uStack_1e30 >> 0x30);
          sVar48 = local_22a * sVar48;
          uStack_160 = uStack_1e30;
          auVar33._8_8_ = uStack_210;
          auVar33._0_8_ = local_218;
          auVar32._8_8_ = uStack_1e30;
          auVar32._0_8_ = local_168;
          auVar49 = pmulhw(auVar33,auVar32);
          uVar1 = local_1cd8;
          uVar2 = uStack_1cd0;
          local_d8 = CONCAT26(local_22a * local_228._6_2_,
                              CONCAT24(local_22a * local_228._4_2_,
                                       CONCAT22(local_22a * local_228._2_2_,sVar48)));
          uStack_d0 = CONCAT26(local_22a * uStack_220._6_2_,
                               CONCAT24(local_22a * uStack_220._4_2_,
                                        CONCAT22(local_22a * uStack_220._2_2_,
                                                 local_22a * (short)uStack_1e30)));
          local_1e68 = auVar49._0_8_;
          local_e8 = local_1e68;
          uStack_1e60 = auVar49._8_8_;
          uStack_e0 = uStack_1e60;
          local_a38 = CONCAT22(auVar49._0_2_,sVar48);
          uStack_a34 = CONCAT22(auVar49._2_2_,local_22a * local_228._2_2_);
          uStack_a30 = CONCAT22(auVar49._4_2_,local_22a * local_228._4_2_);
          uStack_a2c = CONCAT22(auVar49._6_2_,local_22a * local_228._6_2_);
          local_a28._0_4_ = (int)local_1cd8;
          local_a28._4_4_ = (int)((ulong)local_1cd8 >> 0x20);
          uStack_a20._0_4_ = (int)uStack_1cd0;
          uStack_a20._4_4_ = (int)((ulong)uStack_1cd0 >> 0x20);
          local_1cd8 = CONCAT44(local_a28._4_4_ + uStack_a34,(int)local_a28 + local_a38);
          uStack_1cd0 = CONCAT44(uStack_a20._4_4_ + uStack_a2c,(int)uStack_a20 + uStack_a30);
          local_1c20 = (long *)((long)local_1c20 + 1);
          local_1c70 = (long *)((long)local_1c70 + 4);
          local_a28 = uVar1;
          uStack_a20 = uVar2;
          local_668 = local_598;
          local_2a8 = local_598;
          local_228 = local_168;
          uStack_220 = uStack_1e30;
          local_1a8 = local_218;
          uStack_1a0 = uStack_210;
          local_198 = local_22a;
          local_196 = local_22a;
          local_194 = local_22a;
          local_192 = local_22a;
          local_190 = local_22a;
          local_18e = local_22a;
          local_18c = local_22a;
          local_18a = local_22a;
          local_158 = local_218;
          uStack_150 = uStack_210;
        }
        local_7a0 = local_19b0;
        local_7b8 = local_1cd8;
        uStack_7b0 = uStack_1cd0;
        *local_19b0 = local_1cd8;
        local_19b0[1] = uStack_1cd0;
        local_19b0 = local_19b0 + 2;
        local_1458 = local_1498;
        local_1448 = local_14a0;
        local_1c98 = local_c98;
      }
      local_1418 = local_14b8;
      local_19d8 = local_bf0;
    }
    ppvVar70 = &local_1598;
    if (local_1590 != (int *)0x0) {
      local_146c = 0xffffffff;
      LOCK();
      local_1470 = *local_1590;
      *local_1590 = *local_1590 + -1;
      UNLOCK();
      if (local_1470 == 1) {
        local_1490 = ppvVar70;
        local_1468 = ppvVar70;
        if (local_1578 == (long *)0x0) {
          local_f10 = local_1598;
          if (local_1598 != (void *)0x0) {
            free(local_1598);
          }
        }
        else {
          (**(code **)(*local_1578 + 0x18))(local_1578,local_1598);
        }
      }
    }
    *ppvVar70 = (void *)0x0;
    ppvVar70[2] = (void *)0x0;
    *(undefined4 *)(ppvVar70 + 3) = 0;
    *(undefined4 *)(ppvVar70 + 5) = 0;
    *(undefined4 *)((long)ppvVar70 + 0x2c) = 0;
    *(undefined4 *)(ppvVar70 + 6) = 0;
    *(undefined4 *)((long)ppvVar70 + 0x34) = 0;
    *(undefined4 *)(ppvVar70 + 7) = 0;
    ppvVar70[8] = (void *)0x0;
    ppvVar70[1] = (void *)0x0;
  }
  else {
    im2col_sgemm_pack1to4_int8_sse_xop
              ((Mat *)CONCAT26(in_stack_ffffffffffffdeb6,
                               CONCAT24(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0)),
               in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}